

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  byte bVar76;
  ulong uVar77;
  byte bVar78;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ulong uVar79;
  long lVar80;
  ulong uVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar133;
  uint uVar134;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  uint uVar135;
  uint uVar139;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float pp;
  float fVar140;
  float fVar141;
  undefined4 uVar142;
  float fVar160;
  float fVar161;
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar144 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar202;
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar216;
  float fVar217;
  float fVar224;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar223;
  float fVar225;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar230;
  undefined1 auVar229 [64];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar241;
  float fVar242;
  undefined1 auVar237 [16];
  float fVar243;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  float fVar248;
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8f8;
  undefined2 local_8f2;
  ulong local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [8];
  float fStack_8a8;
  float fStack_8a4;
  RTCFilterFunctionNArguments local_8a0;
  undefined4 local_86c;
  uint local_868;
  int local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_630;
  float local_628;
  float local_624;
  undefined4 local_620;
  uint local_61c;
  uint local_618;
  uint local_614;
  uint local_610;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  Primitive *local_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 auStack_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar122 [32];
  
  PVar5 = prim[1];
  uVar79 = (ulong)(byte)PVar5;
  fVar203 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar17 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar202 = fVar203 * auVar17._0_4_;
  fVar140 = fVar203 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar87);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar98 = vpmovsxbd_avx2(auVar3);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar99 = vpmovsxbd_avx2(auVar91);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar103 = vpmovsxbd_avx2(auVar84);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar100 = vcvtdq2ps_avx(auVar103);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar79 + 6);
  auVar96 = vpmovsxbd_avx2(auVar88);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar81 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar108 = vpmovsxbd_avx2(auVar85);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar81 + uVar79 + 6);
  auVar101 = vpmovsxbd_avx2(auVar89);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar251 = ZEXT3264(auVar101);
  uVar77 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar94 = vpmovsxbd_avx2(auVar4);
  auVar102 = vcvtdq2ps_avx(auVar94);
  auVar254 = ZEXT3264(auVar102);
  auVar115._4_4_ = fVar140;
  auVar115._0_4_ = fVar140;
  auVar115._8_4_ = fVar140;
  auVar115._12_4_ = fVar140;
  auVar115._16_4_ = fVar140;
  auVar115._20_4_ = fVar140;
  auVar115._24_4_ = fVar140;
  auVar115._28_4_ = fVar140;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar106 = ZEXT1632(CONCAT412(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar140))));
  auVar104 = vpermps_avx2(auVar105,auVar106);
  auVar93 = vpermps_avx512vl(auVar92,auVar106);
  fVar140 = auVar93._0_4_;
  fVar241 = auVar93._4_4_;
  auVar106._4_4_ = fVar241 * auVar98._4_4_;
  auVar106._0_4_ = fVar140 * auVar98._0_4_;
  fVar242 = auVar93._8_4_;
  auVar106._8_4_ = fVar242 * auVar98._8_4_;
  fVar243 = auVar93._12_4_;
  auVar106._12_4_ = fVar243 * auVar98._12_4_;
  fVar216 = auVar93._16_4_;
  auVar106._16_4_ = fVar216 * auVar98._16_4_;
  fVar217 = auVar93._20_4_;
  auVar106._20_4_ = fVar217 * auVar98._20_4_;
  fVar165 = auVar93._24_4_;
  auVar106._24_4_ = fVar165 * auVar98._24_4_;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar96._4_4_ * fVar241;
  auVar103._0_4_ = auVar96._0_4_ * fVar140;
  auVar103._8_4_ = auVar96._8_4_ * fVar242;
  auVar103._12_4_ = auVar96._12_4_ * fVar243;
  auVar103._16_4_ = auVar96._16_4_ * fVar216;
  auVar103._20_4_ = auVar96._20_4_ * fVar217;
  auVar103._24_4_ = auVar96._24_4_ * fVar165;
  auVar103._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar102._4_4_ * fVar241;
  auVar94._0_4_ = auVar102._0_4_ * fVar140;
  auVar94._8_4_ = auVar102._8_4_ * fVar242;
  auVar94._12_4_ = auVar102._12_4_ * fVar243;
  auVar94._16_4_ = auVar102._16_4_ * fVar216;
  auVar94._20_4_ = auVar102._20_4_ * fVar217;
  auVar94._24_4_ = auVar102._24_4_ * fVar165;
  auVar94._28_4_ = auVar93._28_4_;
  auVar86 = vfmadd231ps_fma(auVar106,auVar104,auVar95);
  auVar87 = vfmadd231ps_fma(auVar103,auVar104,auVar100);
  auVar3 = vfmadd231ps_fma(auVar94,auVar101,auVar104);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar115,auVar97);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar115,auVar99);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar108,auVar115);
  auVar116._4_4_ = fVar202;
  auVar116._0_4_ = fVar202;
  auVar116._8_4_ = fVar202;
  auVar116._12_4_ = fVar202;
  auVar116._16_4_ = fVar202;
  auVar116._20_4_ = fVar202;
  auVar116._24_4_ = fVar202;
  auVar116._28_4_ = fVar202;
  auVar94 = ZEXT1632(CONCAT412(fVar203 * auVar17._12_4_,
                               CONCAT48(fVar203 * auVar17._8_4_,
                                        CONCAT44(fVar203 * auVar17._4_4_,fVar202))));
  auVar103 = vpermps_avx2(auVar105,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  fVar203 = auVar94._0_4_;
  fVar140 = auVar94._4_4_;
  auVar104._4_4_ = fVar140 * auVar98._4_4_;
  auVar104._0_4_ = fVar203 * auVar98._0_4_;
  fVar241 = auVar94._8_4_;
  auVar104._8_4_ = fVar241 * auVar98._8_4_;
  fVar242 = auVar94._12_4_;
  auVar104._12_4_ = fVar242 * auVar98._12_4_;
  fVar243 = auVar94._16_4_;
  auVar104._16_4_ = fVar243 * auVar98._16_4_;
  fVar216 = auVar94._20_4_;
  auVar104._20_4_ = fVar216 * auVar98._20_4_;
  fVar217 = auVar94._24_4_;
  auVar104._24_4_ = fVar217 * auVar98._24_4_;
  auVar104._28_4_ = 1;
  auVar92._4_4_ = auVar96._4_4_ * fVar140;
  auVar92._0_4_ = auVar96._0_4_ * fVar203;
  auVar92._8_4_ = auVar96._8_4_ * fVar241;
  auVar92._12_4_ = auVar96._12_4_ * fVar242;
  auVar92._16_4_ = auVar96._16_4_ * fVar243;
  auVar92._20_4_ = auVar96._20_4_ * fVar216;
  auVar92._24_4_ = auVar96._24_4_ * fVar217;
  auVar92._28_4_ = auVar98._28_4_;
  auVar96._4_4_ = auVar102._4_4_ * fVar140;
  auVar96._0_4_ = auVar102._0_4_ * fVar203;
  auVar96._8_4_ = auVar102._8_4_ * fVar241;
  auVar96._12_4_ = auVar102._12_4_ * fVar242;
  auVar96._16_4_ = auVar102._16_4_ * fVar243;
  auVar96._20_4_ = auVar102._20_4_ * fVar216;
  auVar96._24_4_ = auVar102._24_4_ * fVar217;
  auVar96._28_4_ = auVar94._28_4_;
  auVar91 = vfmadd231ps_fma(auVar104,auVar103,auVar95);
  auVar84 = vfmadd231ps_fma(auVar92,auVar103,auVar100);
  auVar88 = vfmadd231ps_fma(auVar96,auVar103,auVar101);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar116,auVar97);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar116,auVar99);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar116,auVar108);
  auVar97 = vandps_avx(ZEXT1632(auVar86),auVar112);
  auVar114._8_4_ = 0x219392ef;
  auVar114._0_8_ = 0x219392ef219392ef;
  auVar114._12_4_ = 0x219392ef;
  auVar114._16_4_ = 0x219392ef;
  auVar114._20_4_ = 0x219392ef;
  auVar114._24_4_ = 0x219392ef;
  auVar114._28_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar97,auVar114,1);
  bVar9 = (bool)((byte)uVar81 & 1);
  auVar93._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._0_4_;
  bVar9 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._4_4_;
  bVar9 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._8_4_;
  bVar9 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar86._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar87),auVar112);
  uVar81 = vcmpps_avx512vl(auVar97,auVar114,1);
  bVar9 = (bool)((byte)uVar81 & 1);
  auVar107._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar87._0_4_;
  bVar9 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar87._4_4_;
  bVar9 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar87._8_4_;
  bVar9 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar87._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar3),auVar112);
  uVar81 = vcmpps_avx512vl(auVar97,auVar114,1);
  bVar9 = (bool)((byte)uVar81 & 1);
  auVar97._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar3._0_4_;
  bVar9 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar3._4_4_;
  bVar9 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar3._8_4_;
  bVar9 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar3._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar93);
  auVar113._8_4_ = 0x3f800000;
  auVar113._0_8_ = 0x3f8000003f800000;
  auVar113._12_4_ = 0x3f800000;
  auVar113._16_4_ = 0x3f800000;
  auVar113._20_4_ = 0x3f800000;
  auVar113._24_4_ = 0x3f800000;
  auVar113._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar93,auVar95,auVar113);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar107);
  auVar87 = vfnmadd213ps_fma(auVar107,auVar95,auVar113);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar97);
  auVar3 = vfnmadd213ps_fma(auVar97,auVar95,auVar113);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar95,auVar95);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar91));
  auVar108._4_4_ = auVar86._4_4_ * auVar97._4_4_;
  auVar108._0_4_ = auVar86._0_4_ * auVar97._0_4_;
  auVar108._8_4_ = auVar86._8_4_ * auVar97._8_4_;
  auVar108._12_4_ = auVar86._12_4_ * auVar97._12_4_;
  auVar108._16_4_ = auVar97._16_4_ * 0.0;
  auVar108._20_4_ = auVar97._20_4_ * 0.0;
  auVar108._24_4_ = auVar97._24_4_ * 0.0;
  auVar108._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar91));
  auVar96 = vpbroadcastd_avx512vl();
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar111._0_4_ = auVar86._0_4_ * auVar97._0_4_;
  auVar111._4_4_ = auVar86._4_4_ * auVar97._4_4_;
  auVar111._8_4_ = auVar86._8_4_ * auVar97._8_4_;
  auVar111._12_4_ = auVar86._12_4_ * auVar97._12_4_;
  auVar111._16_4_ = auVar97._16_4_ * 0.0;
  auVar111._20_4_ = auVar97._20_4_ * 0.0;
  auVar111._24_4_ = auVar97._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar79 * -2 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar84));
  auVar101._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar101._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar101._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar101._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar101._16_4_ = auVar97._16_4_ * 0.0;
  auVar101._20_4_ = auVar97._20_4_ * 0.0;
  auVar101._24_4_ = auVar97._24_4_ * 0.0;
  auVar101._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar95);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar84));
  auVar110._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar110._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar110._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar110._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar110._16_4_ = auVar97._16_4_ * 0.0;
  auVar110._20_4_ = auVar97._20_4_ * 0.0;
  auVar110._24_4_ = auVar97._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 + uVar79 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar88));
  auVar102._4_4_ = auVar97._4_4_ * auVar3._4_4_;
  auVar102._0_4_ = auVar97._0_4_ * auVar3._0_4_;
  auVar102._8_4_ = auVar97._8_4_ * auVar3._8_4_;
  auVar102._12_4_ = auVar97._12_4_ * auVar3._12_4_;
  auVar102._16_4_ = auVar97._16_4_ * 0.0;
  auVar102._20_4_ = auVar97._20_4_ * 0.0;
  auVar102._24_4_ = auVar97._24_4_ * 0.0;
  auVar102._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar88));
  auVar109._0_4_ = auVar3._0_4_ * auVar97._0_4_;
  auVar109._4_4_ = auVar3._4_4_ * auVar97._4_4_;
  auVar109._8_4_ = auVar3._8_4_ * auVar97._8_4_;
  auVar109._12_4_ = auVar3._12_4_ * auVar97._12_4_;
  auVar109._16_4_ = auVar97._16_4_ * 0.0;
  auVar109._20_4_ = auVar97._20_4_ * 0.0;
  auVar109._24_4_ = auVar97._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar108,auVar111);
  auVar95 = vpminsd_avx2(auVar101,auVar110);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95 = vpminsd_avx2(auVar102,auVar109);
  uVar142 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar98._4_4_ = uVar142;
  auVar98._0_4_ = uVar142;
  auVar98._8_4_ = uVar142;
  auVar98._12_4_ = uVar142;
  auVar98._16_4_ = uVar142;
  auVar98._20_4_ = uVar142;
  auVar98._24_4_ = uVar142;
  auVar98._28_4_ = uVar142;
  auVar95 = vmaxps_avx512vl(auVar95,auVar98);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_2a0 = vmulps_avx512vl(auVar97,auVar95);
  auVar97 = vpmaxsd_avx2(auVar108,auVar111);
  auVar95 = vpmaxsd_avx2(auVar101,auVar110);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar95 = vpmaxsd_avx2(auVar102,auVar109);
  fVar203 = (ray->super_RayK<1>).tfar;
  auVar99._4_4_ = fVar203;
  auVar99._0_4_ = fVar203;
  auVar99._8_4_ = fVar203;
  auVar99._12_4_ = fVar203;
  auVar99._16_4_ = fVar203;
  auVar99._20_4_ = fVar203;
  auVar99._24_4_ = fVar203;
  auVar99._28_4_ = fVar203;
  auVar95 = vminps_avx512vl(auVar95,auVar99);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar100._8_4_ = 0x3f800003;
  auVar100._0_8_ = 0x3f8000033f800003;
  auVar100._12_4_ = 0x3f800003;
  auVar100._16_4_ = 0x3f800003;
  auVar100._20_4_ = 0x3f800003;
  auVar100._24_4_ = 0x3f800003;
  auVar100._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar100);
  uVar20 = vpcmpgtd_avx512vl(auVar96,_DAT_01fe9900);
  uVar18 = vcmpps_avx512vl(local_2a0,auVar97,2);
  if ((byte)((byte)uVar18 & (byte)uVar20) == 0) {
    return;
  }
  uVar81 = (ulong)(byte)((byte)uVar18 & (byte)uVar20);
  local_488 = prim;
LAB_01d6546e:
  lVar80 = 0;
  for (uVar77 = uVar81; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  local_8f0 = (ulong)*(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_8e8 = (ulong)*(uint *)(prim + lVar80 * 4 + 6);
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar80 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  lVar80 = *(long *)&pGVar6[1].time_range.upper;
  auVar86 = *(undefined1 (*) [16])(lVar80 + (long)p_Var7 * uVar77);
  auVar87 = *(undefined1 (*) [16])(lVar80 + (uVar77 + 1) * (long)p_Var7);
  auVar3 = *(undefined1 (*) [16])(lVar80 + (uVar77 + 2) * (long)p_Var7);
  uVar81 = uVar81 - 1 & uVar81;
  auVar91 = *(undefined1 (*) [16])(lVar80 + (uVar77 + 3) * (long)p_Var7);
  if (uVar81 != 0) {
    uVar79 = uVar81 - 1 & uVar81;
    for (uVar77 = uVar81; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    }
    if (uVar79 != 0) {
      for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar90._0_4_ = auVar86._0_4_ + auVar87._0_4_ + auVar3._0_4_ + auVar91._0_4_;
  auVar90._4_4_ = auVar86._4_4_ + auVar87._4_4_ + auVar3._4_4_ + auVar91._4_4_;
  auVar90._8_4_ = auVar86._8_4_ + auVar87._8_4_ + auVar3._8_4_ + auVar91._8_4_;
  auVar90._12_4_ = auVar86._12_4_ + auVar87._12_4_ + auVar3._12_4_ + auVar91._12_4_;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar17._8_4_ = 0x3e800000;
  auVar17._0_8_ = 0x3e8000003e800000;
  auVar17._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar90,auVar17);
  auVar84 = vsubps_avx(auVar84,(undefined1  [16])aVar1);
  auVar84 = vdpps_avx(auVar84,(undefined1  [16])aVar2,0x7f);
  auVar88 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar89 = ZEXT816(0) << 0x40;
  auVar247 = ZEXT1664(auVar89);
  auVar237._4_12_ = ZEXT812(0) << 0x20;
  auVar237._0_4_ = auVar88._0_4_;
  auVar85 = vrcp14ss_avx512f(auVar89,auVar237);
  auVar88 = vfnmadd213ss_fma(auVar85,auVar88,ZEXT416(0x40000000));
  auVar244 = ZEXT1664(auVar88);
  fVar203 = auVar84._0_4_ * auVar85._0_4_ * auVar88._0_4_;
  local_4f0 = ZEXT416((uint)fVar203);
  auVar226._4_4_ = fVar203;
  auVar226._0_4_ = fVar203;
  auVar226._8_4_ = fVar203;
  auVar226._12_4_ = fVar203;
  fStack_5d0 = fVar203;
  _local_5e0 = auVar226;
  fStack_5cc = fVar203;
  fStack_5c8 = fVar203;
  fStack_5c4 = fVar203;
  auVar84 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar226);
  auVar84 = vblendps_avx(auVar84,auVar89,8);
  auVar86 = vsubps_avx(auVar86,auVar84);
  uVar142 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_360._4_4_ = uVar142;
  local_360._0_4_ = uVar142;
  local_360._8_4_ = uVar142;
  local_360._12_4_ = uVar142;
  local_360._16_4_ = uVar142;
  local_360._20_4_ = uVar142;
  local_360._24_4_ = uVar142;
  local_360._28_4_ = uVar142;
  auVar240 = ZEXT3264(local_360);
  auVar3 = vsubps_avx(auVar3,auVar84);
  local_680 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar264 = ZEXT3264(local_680);
  local_3e0 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  auVar87 = vsubps_avx(auVar87,auVar84);
  auVar236 = ZEXT1664(auVar87);
  auVar91 = vsubps_avx(auVar91,auVar84);
  auVar229 = ZEXT1664(auVar91);
  local_7c0 = vbroadcastss_avx512vl(auVar86);
  auVar262 = ZEXT3264(local_7c0);
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_560 = ZEXT1632(auVar86);
  local_7e0 = vpermps_avx512vl(auVar120,local_560);
  auVar256 = ZEXT3264(local_7e0);
  auVar121._8_4_ = 2;
  auVar121._0_8_ = 0x200000002;
  auVar121._12_4_ = 2;
  auVar121._16_4_ = 2;
  auVar121._20_4_ = 2;
  auVar121._24_4_ = 2;
  auVar121._28_4_ = 2;
  local_6e0 = vpermps_avx512vl(auVar121,local_560);
  auVar257 = ZEXT3264(local_6e0);
  auVar122._8_4_ = 3;
  auVar122._0_8_ = 0x300000003;
  auVar122._12_4_ = 3;
  auVar122._16_4_ = 3;
  auVar122._20_4_ = 3;
  auVar122._24_4_ = 3;
  auVar122._28_4_ = 3;
  local_700 = vpermps_avx512vl(auVar122,local_560);
  auVar258 = ZEXT3264(local_700);
  local_800 = vbroadcastss_avx512vl(auVar87);
  auVar259 = ZEXT3264(local_800);
  local_5a0 = ZEXT1632(auVar87);
  local_720 = vpermps_avx512vl(auVar120,local_5a0);
  auVar260 = ZEXT3264(local_720);
  local_820 = vpermps_avx512vl(auVar121,local_5a0);
  auVar261 = ZEXT3264(local_820);
  local_740 = vpermps_avx512vl(auVar122,local_5a0);
  auVar263 = ZEXT3264(local_740);
  local_840 = vbroadcastss_avx512vl(auVar3);
  auVar265 = ZEXT3264(local_840);
  local_580 = ZEXT1632(auVar3);
  local_760 = vpermps_avx512vl(auVar120,local_580);
  auVar266 = ZEXT3264(local_760);
  local_780 = vpermps_avx512vl(auVar121,local_580);
  auVar267 = ZEXT3264(local_780);
  local_860 = vpermps_avx512vl(auVar122,local_580);
  auVar269 = ZEXT3264(local_860);
  local_1e0 = auVar91._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  _local_5c0 = ZEXT1632(auVar91);
  _local_200 = vpermps_avx2(auVar120,_local_5c0);
  local_260 = vpermps_avx512vl(auVar121,_local_5c0);
  local_280 = vpermps_avx2(auVar122,_local_5c0);
  auVar97 = vpermps_avx2(auVar121,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  local_240 = vfmadd231ps_avx512vl(auVar97,local_680,local_680);
  auVar86 = vfmadd231ps_fma(local_240,local_360,local_360);
  local_220 = ZEXT1632(auVar86);
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar86),auVar117);
  local_864 = 1;
  uVar77 = 0;
  local_390 = ZEXT816(0x3f80000000000000);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar268 = ZEXT3264(auVar97);
  do {
    auVar86 = vmovshdup_avx(local_390);
    auVar86 = vsubps_avx(auVar86,local_390);
    auVar143._0_4_ = auVar86._0_4_;
    fVar225 = auVar143._0_4_ * 0.04761905;
    uVar142 = local_390._0_4_;
    local_660._4_4_ = uVar142;
    local_660._0_4_ = uVar142;
    local_660._8_4_ = uVar142;
    local_660._12_4_ = uVar142;
    local_660._16_4_ = uVar142;
    local_660._20_4_ = uVar142;
    local_660._24_4_ = uVar142;
    local_660._28_4_ = uVar142;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    local_7a0._16_4_ = auVar143._0_4_;
    local_7a0._0_16_ = auVar143;
    local_7a0._20_4_ = auVar143._0_4_;
    local_7a0._24_4_ = auVar143._0_4_;
    local_7a0._28_4_ = auVar143._0_4_;
    auVar86 = vfmadd231ps_fma(local_660,local_7a0,_DAT_01faff20);
    auVar95 = vsubps_avx512vl(auVar268._0_32_,ZEXT1632(auVar86));
    fVar140 = auVar95._0_4_;
    fVar242 = auVar95._4_4_;
    fVar216 = auVar95._8_4_;
    fVar165 = auVar95._12_4_;
    fVar222 = auVar95._16_4_;
    fVar223 = auVar95._20_4_;
    fVar224 = auVar95._24_4_;
    fVar141 = fVar140 * fVar140 * fVar140;
    fVar160 = fVar242 * fVar242 * fVar242;
    auVar39._4_4_ = fVar160;
    auVar39._0_4_ = fVar141;
    fVar161 = fVar216 * fVar216 * fVar216;
    auVar39._8_4_ = fVar161;
    fVar162 = fVar165 * fVar165 * fVar165;
    auVar39._12_4_ = fVar162;
    fVar163 = fVar222 * fVar222 * fVar222;
    auVar39._16_4_ = fVar163;
    fVar164 = fVar223 * fVar223 * fVar223;
    auVar39._20_4_ = fVar164;
    fVar166 = fVar224 * fVar224 * fVar224;
    auVar39._24_4_ = fVar166;
    auVar39._28_4_ = auVar143._0_4_;
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar98 = vmulps_avx512vl(auVar39,auVar97);
    fVar241 = auVar86._0_4_;
    fVar243 = auVar86._4_4_;
    fVar217 = auVar86._8_4_;
    fVar202 = auVar86._12_4_;
    fVar180 = fVar241 * fVar241 * fVar241;
    fVar199 = fVar243 * fVar243 * fVar243;
    fVar200 = fVar217 * fVar217 * fVar217;
    fVar201 = fVar202 * fVar202 * fVar202;
    auVar245._0_4_ = fVar241 * fVar140;
    auVar245._4_4_ = fVar243 * fVar242;
    auVar245._8_4_ = fVar217 * fVar216;
    auVar245._12_4_ = fVar202 * fVar165;
    auVar245._16_4_ = fVar222 * 0.0;
    auVar245._20_4_ = fVar223 * 0.0;
    auVar245._28_36_ = auVar244._28_36_;
    auVar245._24_4_ = fVar224 * 0.0;
    fVar203 = auVar254._28_4_;
    auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar201,CONCAT48(fVar200,CONCAT44(fVar199,fVar180))
                                                )),auVar97);
    fVar248 = auVar99._28_4_ + auVar143._0_4_;
    fVar230 = fVar248 + auVar251._28_4_ + auVar229._28_4_;
    auVar40._4_4_ = fVar160 * 0.16666667;
    auVar40._0_4_ = fVar141 * 0.16666667;
    auVar40._8_4_ = fVar161 * 0.16666667;
    auVar40._12_4_ = fVar162 * 0.16666667;
    auVar40._16_4_ = fVar163 * 0.16666667;
    auVar40._20_4_ = fVar164 * 0.16666667;
    auVar40._24_4_ = fVar166 * 0.16666667;
    auVar40._28_4_ = fVar248;
    auVar41._4_4_ =
         (auVar245._4_4_ * fVar242 * 12.0 + auVar245._4_4_ * fVar243 * 6.0 + fVar199 + auVar98._4_4_
         ) * 0.16666667;
    auVar41._0_4_ =
         (auVar245._0_4_ * fVar140 * 12.0 + auVar245._0_4_ * fVar241 * 6.0 + fVar180 + auVar98._0_4_
         ) * 0.16666667;
    auVar41._8_4_ =
         (auVar245._8_4_ * fVar216 * 12.0 + auVar245._8_4_ * fVar217 * 6.0 + fVar200 + auVar98._8_4_
         ) * 0.16666667;
    auVar41._12_4_ =
         (auVar245._12_4_ * fVar165 * 12.0 + auVar245._12_4_ * fVar202 * 6.0 +
         fVar201 + auVar98._12_4_) * 0.16666667;
    auVar41._16_4_ =
         (auVar245._16_4_ * fVar222 * 12.0 + auVar245._16_4_ * 0.0 * 6.0 + auVar98._16_4_ + 0.0) *
         0.16666667;
    auVar41._20_4_ =
         (auVar245._20_4_ * fVar223 * 12.0 + auVar245._20_4_ * 0.0 * 6.0 + auVar98._20_4_ + 0.0) *
         0.16666667;
    auVar41._24_4_ =
         (auVar245._24_4_ * fVar224 * 12.0 + auVar245._24_4_ * 0.0 * 6.0 + auVar98._24_4_ + 0.0) *
         0.16666667;
    auVar41._28_4_ = auVar251._28_4_;
    auVar42._4_4_ =
         (auVar99._4_4_ + fVar160 + auVar245._4_4_ * fVar243 * 12.0 + auVar245._4_4_ * fVar242 * 6.0
         ) * 0.16666667;
    auVar42._0_4_ =
         (auVar99._0_4_ + fVar141 + auVar245._0_4_ * fVar241 * 12.0 + auVar245._0_4_ * fVar140 * 6.0
         ) * 0.16666667;
    auVar42._8_4_ =
         (auVar99._8_4_ + fVar161 + auVar245._8_4_ * fVar217 * 12.0 + auVar245._8_4_ * fVar216 * 6.0
         ) * 0.16666667;
    auVar42._12_4_ =
         (auVar99._12_4_ + fVar162 +
         auVar245._12_4_ * fVar202 * 12.0 + auVar245._12_4_ * fVar165 * 6.0) * 0.16666667;
    auVar42._16_4_ =
         (auVar99._16_4_ + fVar163 + auVar245._16_4_ * 0.0 * 12.0 + auVar245._16_4_ * fVar222 * 6.0)
         * 0.16666667;
    auVar42._20_4_ =
         (auVar99._20_4_ + fVar164 + auVar245._20_4_ * 0.0 * 12.0 + auVar245._20_4_ * fVar223 * 6.0)
         * 0.16666667;
    auVar42._24_4_ =
         (auVar99._24_4_ + fVar166 + auVar245._24_4_ * 0.0 * 12.0 + auVar245._24_4_ * fVar224 * 6.0)
         * 0.16666667;
    auVar42._28_4_ = fVar203;
    fVar180 = fVar180 * 0.16666667;
    fVar199 = fVar199 * 0.16666667;
    fVar200 = fVar200 * 0.16666667;
    fVar201 = fVar201 * 0.16666667;
    auVar43._28_4_ = fVar230;
    auVar43._0_28_ = ZEXT1628(CONCAT412(fVar201,CONCAT48(fVar200,CONCAT44(fVar199,fVar180))));
    auVar44._4_4_ = fStack_1dc * fVar199;
    auVar44._0_4_ = local_1e0 * fVar180;
    auVar44._8_4_ = fStack_1d8 * fVar200;
    auVar44._12_4_ = fStack_1d4 * fVar201;
    auVar44._16_4_ = fStack_1d0 * 0.0;
    auVar44._20_4_ = fStack_1cc * 0.0;
    auVar44._24_4_ = fStack_1c8 * 0.0;
    auVar44._28_4_ = 0;
    auVar45._4_4_ = (float)local_200._4_4_ * fVar199;
    auVar45._0_4_ = (float)local_200._0_4_ * fVar180;
    auVar45._8_4_ = fStack_1f8 * fVar200;
    auVar45._12_4_ = fStack_1f4 * fVar201;
    auVar45._16_4_ = fStack_1f0 * 0.0;
    auVar45._20_4_ = fStack_1ec * 0.0;
    auVar45._24_4_ = fStack_1e8 * 0.0;
    auVar45._28_4_ = auVar247._28_4_ + fVar203 + auVar98._28_4_ + 0.0;
    auVar98 = vmulps_avx512vl(local_260,auVar43);
    auVar46._4_4_ = local_280._4_4_ * fVar199;
    auVar46._0_4_ = local_280._0_4_ * fVar180;
    auVar46._8_4_ = local_280._8_4_ * fVar200;
    auVar46._12_4_ = local_280._12_4_ * fVar201;
    auVar46._16_4_ = local_280._16_4_ * 0.0;
    auVar46._20_4_ = local_280._20_4_ * 0.0;
    auVar46._24_4_ = local_280._24_4_ * 0.0;
    auVar46._28_4_ = fVar230;
    auVar99 = vfmadd231ps_avx512vl(auVar44,auVar42,auVar265._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar45,auVar42,auVar266._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar42,auVar267._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar46,auVar269._0_32_,auVar42);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar41,auVar259._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar41,auVar260._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar41,auVar261._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar263._0_32_,auVar41);
    auVar101 = vfmadd231ps_avx512vl(auVar99,auVar40,auVar262._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar100,auVar40,auVar256._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar98,auVar40,auVar257._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar96,auVar258._0_32_,auVar40);
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar99 = vxorps_avx512vl(auVar95,auVar94);
    auVar100 = vxorps_avx512vl(ZEXT1632(auVar86),auVar94);
    auVar220._0_4_ = auVar100._0_4_ * fVar241;
    auVar220._4_4_ = auVar100._4_4_ * fVar243;
    auVar220._8_4_ = auVar100._8_4_ * fVar217;
    auVar220._12_4_ = auVar100._12_4_ * fVar202;
    auVar220._16_4_ = auVar100._16_4_ * 0.0;
    auVar220._20_4_ = auVar100._20_4_ * 0.0;
    auVar220._24_4_ = auVar100._24_4_ * 0.0;
    auVar220._28_4_ = 0;
    auVar96 = vmulps_avx512vl(auVar245._0_32_,auVar97);
    auVar97 = vsubps_avx(auVar220,auVar96);
    auVar47._4_4_ = auVar99._4_4_ * fVar242 * 0.5;
    auVar47._0_4_ = auVar99._0_4_ * fVar140 * 0.5;
    auVar47._8_4_ = auVar99._8_4_ * fVar216 * 0.5;
    auVar47._12_4_ = auVar99._12_4_ * fVar165 * 0.5;
    auVar47._16_4_ = auVar99._16_4_ * fVar222 * 0.5;
    auVar47._20_4_ = auVar99._20_4_ * fVar223 * 0.5;
    auVar47._24_4_ = auVar99._24_4_ * fVar224 * 0.5;
    auVar47._28_4_ = auVar95._28_4_;
    auVar48._4_4_ = auVar97._4_4_ * 0.5;
    auVar48._0_4_ = auVar97._0_4_ * 0.5;
    auVar48._8_4_ = auVar97._8_4_ * 0.5;
    auVar48._12_4_ = auVar97._12_4_ * 0.5;
    auVar48._16_4_ = auVar97._16_4_ * 0.5;
    auVar48._20_4_ = auVar97._20_4_ * 0.5;
    auVar48._24_4_ = auVar97._24_4_ * 0.5;
    auVar48._28_4_ = auVar97._28_4_;
    auVar49._4_4_ = (auVar96._4_4_ + fVar242 * fVar242) * 0.5;
    auVar49._0_4_ = (auVar96._0_4_ + fVar140 * fVar140) * 0.5;
    auVar49._8_4_ = (auVar96._8_4_ + fVar216 * fVar216) * 0.5;
    auVar49._12_4_ = (auVar96._12_4_ + fVar165 * fVar165) * 0.5;
    auVar49._16_4_ = (auVar96._16_4_ + fVar222 * fVar222) * 0.5;
    auVar49._20_4_ = (auVar96._20_4_ + fVar223 * fVar223) * 0.5;
    auVar49._24_4_ = (auVar96._24_4_ + fVar224 * fVar224) * 0.5;
    auVar49._28_4_ = auVar96._28_4_ + auVar236._28_4_;
    fVar140 = fVar241 * fVar241 * 0.5;
    fVar241 = fVar243 * fVar243 * 0.5;
    fVar242 = fVar217 * fVar217 * 0.5;
    fVar243 = fVar202 * fVar202 * 0.5;
    auVar50._28_4_ = auVar240._28_4_;
    auVar50._0_28_ = ZEXT1628(CONCAT412(fVar243,CONCAT48(fVar242,CONCAT44(fVar241,fVar140))));
    auVar51._4_4_ = fStack_1dc * fVar241;
    auVar51._0_4_ = local_1e0 * fVar140;
    auVar51._8_4_ = fStack_1d8 * fVar242;
    auVar51._12_4_ = fStack_1d4 * fVar243;
    auVar51._16_4_ = fStack_1d0 * 0.0;
    auVar51._20_4_ = fStack_1cc * 0.0;
    auVar51._24_4_ = fStack_1c8 * 0.0;
    auVar51._28_4_ = 0x3f000000;
    auVar52._4_4_ = (float)local_200._4_4_ * fVar241;
    auVar52._0_4_ = (float)local_200._0_4_ * fVar140;
    auVar52._8_4_ = fStack_1f8 * fVar242;
    auVar52._12_4_ = fStack_1f4 * fVar243;
    auVar52._16_4_ = fStack_1f0 * 0.0;
    auVar52._20_4_ = fStack_1ec * 0.0;
    auVar52._24_4_ = fStack_1e8 * 0.0;
    auVar52._28_4_ = auVar100._28_4_;
    auVar97 = vmulps_avx512vl(local_260,auVar50);
    auVar53._4_4_ = fVar241 * local_280._4_4_;
    auVar53._0_4_ = fVar140 * local_280._0_4_;
    auVar53._8_4_ = fVar242 * local_280._8_4_;
    auVar53._12_4_ = fVar243 * local_280._12_4_;
    auVar53._16_4_ = local_280._16_4_ * 0.0;
    auVar53._20_4_ = local_280._20_4_ * 0.0;
    auVar53._24_4_ = local_280._24_4_ * 0.0;
    auVar53._28_4_ = auVar240._28_4_;
    auVar95 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar265._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar266._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar49,auVar267._0_32_);
    auVar86 = vfmadd231ps_fma(auVar53,auVar269._0_32_,auVar49);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar48,auVar259._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar48,auVar260._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar48,auVar261._0_32_);
    auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar263._0_32_,auVar48);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar47,auVar262._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar47,auVar256._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar47,auVar257._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar258._0_32_,auVar47);
    auVar124._4_4_ = auVar95._4_4_ * fVar225;
    auVar124._0_4_ = auVar95._0_4_ * fVar225;
    auVar124._8_4_ = auVar95._8_4_ * fVar225;
    auVar124._12_4_ = auVar95._12_4_ * fVar225;
    auVar124._16_4_ = auVar95._16_4_ * fVar225;
    auVar124._20_4_ = auVar95._20_4_ * fVar225;
    auVar124._24_4_ = auVar95._24_4_ * fVar225;
    auVar124._28_4_ = auVar269._28_4_;
    auVar54._4_4_ = auVar99._4_4_ * fVar225;
    auVar54._0_4_ = auVar99._0_4_ * fVar225;
    auVar54._8_4_ = auVar99._8_4_ * fVar225;
    auVar54._12_4_ = auVar99._12_4_ * fVar225;
    auVar54._16_4_ = auVar99._16_4_ * fVar225;
    auVar54._20_4_ = auVar99._20_4_ * fVar225;
    auVar54._24_4_ = auVar99._24_4_ * fVar225;
    auVar54._28_4_ = fVar203;
    auVar254 = ZEXT3264(auVar54);
    auVar55._4_4_ = auVar97._4_4_ * fVar225;
    auVar55._0_4_ = auVar97._0_4_ * fVar225;
    auVar55._8_4_ = auVar97._8_4_ * fVar225;
    auVar55._12_4_ = auVar97._12_4_ * fVar225;
    auVar55._16_4_ = auVar97._16_4_ * fVar225;
    auVar55._20_4_ = auVar97._20_4_ * fVar225;
    auVar55._24_4_ = auVar97._24_4_ * fVar225;
    auVar55._28_4_ = auVar97._28_4_;
    fVar203 = auVar100._0_4_ * fVar225;
    fVar140 = auVar100._4_4_ * fVar225;
    auVar56._4_4_ = fVar140;
    auVar56._0_4_ = fVar203;
    fVar241 = auVar100._8_4_ * fVar225;
    auVar56._8_4_ = fVar241;
    fVar242 = auVar100._12_4_ * fVar225;
    auVar56._12_4_ = fVar242;
    fVar243 = auVar100._16_4_ * fVar225;
    auVar56._16_4_ = fVar243;
    fVar216 = auVar100._20_4_ * fVar225;
    auVar56._20_4_ = fVar216;
    fVar217 = auVar100._24_4_ * fVar225;
    auVar56._24_4_ = fVar217;
    auVar56._28_4_ = fVar225;
    auVar86 = vxorps_avx512vl(auVar268._0_16_,auVar268._0_16_);
    auVar104 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,ZEXT1632(auVar86));
    auVar240 = ZEXT3264(auVar104);
    _local_480 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,ZEXT1632(auVar86));
    auVar99 = ZEXT1632(auVar86);
    auVar105 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,auVar99);
    auVar221._0_4_ = fVar203 + auVar98._0_4_;
    auVar221._4_4_ = fVar140 + auVar98._4_4_;
    auVar221._8_4_ = fVar241 + auVar98._8_4_;
    auVar221._12_4_ = fVar242 + auVar98._12_4_;
    auVar221._16_4_ = fVar243 + auVar98._16_4_;
    auVar221._20_4_ = fVar216 + auVar98._20_4_;
    auVar221._24_4_ = fVar217 + auVar98._24_4_;
    auVar221._28_4_ = fVar225 + auVar98._28_4_;
    auVar97 = vmaxps_avx(auVar98,auVar221);
    auVar95 = vminps_avx(auVar98,auVar221);
    auVar106 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,auVar99);
    auVar92 = vpermt2ps_avx512vl(auVar124,_DAT_01feed00,auVar99);
    auVar93 = vpermt2ps_avx512vl(auVar54,_DAT_01feed00,auVar99);
    auVar117 = ZEXT1632(auVar86);
    auVar107 = vpermt2ps_avx512vl(auVar55,_DAT_01feed00,auVar117);
    auVar98 = vpermt2ps_avx512vl(auVar56,_DAT_01feed00,auVar117);
    auVar98 = vsubps_avx(auVar106,auVar98);
    auVar99 = vsubps_avx(auVar104,auVar101);
    auVar236 = ZEXT3264(auVar99);
    auVar100 = vsubps_avx(_local_480,auVar102);
    auVar96 = vsubps_avx(auVar105,auVar103);
    auVar229 = ZEXT3264(auVar96);
    auVar108 = vmulps_avx512vl(auVar100,auVar55);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar54,auVar96);
    auVar109 = vmulps_avx512vl(auVar96,auVar124);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar55,auVar99);
    auVar110 = vmulps_avx512vl(auVar99,auVar54);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar124,auVar100);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar108 = vmulps_avx512vl(auVar96,auVar96);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar100,auVar100);
    auVar110 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar99);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar108);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar111);
    auVar112 = vmulps_avx512vl(auVar100,auVar107);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar93,auVar96);
    auVar113 = vmulps_avx512vl(auVar96,auVar92);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar107,auVar99);
    auVar114 = vmulps_avx512vl(auVar99,auVar93);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar92,auVar100);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar109 = vmaxps_avx512vl(auVar109,auVar111);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar111 = vmaxps_avx512vl(auVar98,auVar106);
    auVar97 = vmaxps_avx512vl(auVar97,auVar111);
    auVar111 = vaddps_avx512vl(auVar109,auVar97);
    auVar97 = vminps_avx(auVar98,auVar106);
    auVar97 = vminps_avx(auVar95,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar109);
    auVar29._8_4_ = 0x3f800002;
    auVar29._0_8_ = 0x3f8000023f800002;
    auVar29._12_4_ = 0x3f800002;
    auVar29._16_4_ = 0x3f800002;
    auVar29._20_4_ = 0x3f800002;
    auVar29._24_4_ = 0x3f800002;
    auVar29._28_4_ = 0x3f800002;
    auVar95 = vmulps_avx512vl(auVar111,auVar29);
    auVar30._8_4_ = 0x3f7ffffc;
    auVar30._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar30._12_4_ = 0x3f7ffffc;
    auVar30._16_4_ = 0x3f7ffffc;
    auVar30._20_4_ = 0x3f7ffffc;
    auVar30._24_4_ = 0x3f7ffffc;
    auVar30._28_4_ = 0x3f7ffffc;
    local_8e0 = vmulps_avx512vl(auVar97,auVar30);
    auVar97 = vmulps_avx512vl(auVar95,auVar95);
    auVar95 = vrsqrt14ps_avx512vl(auVar110);
    auVar31._8_4_ = 0xbf000000;
    auVar31._0_8_ = 0xbf000000bf000000;
    auVar31._12_4_ = 0xbf000000;
    auVar31._16_4_ = 0xbf000000;
    auVar31._20_4_ = 0xbf000000;
    auVar31._24_4_ = 0xbf000000;
    auVar31._28_4_ = 0xbf000000;
    auVar98 = vmulps_avx512vl(auVar110,auVar31);
    fVar203 = auVar95._0_4_;
    fVar140 = auVar95._4_4_;
    fVar241 = auVar95._8_4_;
    fVar242 = auVar95._12_4_;
    fVar243 = auVar95._16_4_;
    fVar216 = auVar95._20_4_;
    fVar217 = auVar95._24_4_;
    auVar57._4_4_ = fVar140 * fVar140 * fVar140 * auVar98._4_4_;
    auVar57._0_4_ = fVar203 * fVar203 * fVar203 * auVar98._0_4_;
    auVar57._8_4_ = fVar241 * fVar241 * fVar241 * auVar98._8_4_;
    auVar57._12_4_ = fVar242 * fVar242 * fVar242 * auVar98._12_4_;
    auVar57._16_4_ = fVar243 * fVar243 * fVar243 * auVar98._16_4_;
    auVar57._20_4_ = fVar216 * fVar216 * fVar216 * auVar98._20_4_;
    auVar57._24_4_ = fVar217 * fVar217 * fVar217 * auVar98._24_4_;
    auVar57._28_4_ = auVar111._28_4_;
    auVar32._8_4_ = 0x3fc00000;
    auVar32._0_8_ = 0x3fc000003fc00000;
    auVar32._12_4_ = 0x3fc00000;
    auVar32._16_4_ = 0x3fc00000;
    auVar32._20_4_ = 0x3fc00000;
    auVar32._24_4_ = 0x3fc00000;
    auVar32._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar57,auVar95,auVar32);
    auVar98 = vmulps_avx512vl(auVar99,auVar95);
    auVar106 = vmulps_avx512vl(auVar100,auVar95);
    auVar109 = vmulps_avx512vl(auVar96,auVar95);
    auVar110 = vsubps_avx512vl(auVar117,auVar101);
    auVar111 = vsubps_avx512vl(auVar117,auVar102);
    auVar112 = vsubps_avx512vl(auVar117,auVar103);
    auVar70._4_4_ = uStack_3dc;
    auVar70._0_4_ = local_3e0;
    auVar70._8_4_ = uStack_3d8;
    auVar70._12_4_ = uStack_3d4;
    auVar70._16_4_ = uStack_3d0;
    auVar70._20_4_ = uStack_3cc;
    auVar70._24_4_ = uStack_3c8;
    auVar70._28_4_ = uStack_3c4;
    auVar113 = vmulps_avx512vl(auVar70,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar264._0_32_,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_360,auVar110);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar115 = vmulps_avx512vl(auVar70,auVar109);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,auVar264._0_32_);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar98,local_360);
    auVar109 = vmulps_avx512vl(auVar112,auVar109);
    auVar106 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar106);
    auVar98 = vfmadd231ps_avx512vl(auVar106,auVar110,auVar98);
    auVar106 = vmulps_avx512vl(auVar115,auVar115);
    auVar109 = vsubps_avx512vl(local_220,auVar106);
    auVar116 = vmulps_avx512vl(auVar115,auVar98);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar98,auVar98);
    local_600 = vsubps_avx512vl(auVar114,auVar116);
    auVar97 = vsubps_avx512vl(local_600,auVar97);
    local_520 = vmulps_avx512vl(auVar113,auVar113);
    auVar33._8_4_ = 0x40800000;
    auVar33._0_8_ = 0x4080000040800000;
    auVar33._12_4_ = 0x40800000;
    auVar33._16_4_ = 0x40800000;
    auVar33._20_4_ = 0x40800000;
    auVar33._24_4_ = 0x40800000;
    auVar33._28_4_ = 0x40800000;
    _local_540 = vmulps_avx512vl(auVar109,auVar33);
    auVar114 = vmulps_avx512vl(_local_540,auVar97);
    auVar114 = vsubps_avx512vl(local_520,auVar114);
    uVar79 = vcmpps_avx512vl(auVar114,auVar117,5);
    bVar75 = (byte)uVar79;
    fVar203 = (float)local_5e0._0_4_;
    fVar140 = (float)local_5e0._4_4_;
    fVar241 = fStack_5d8;
    fVar242 = fStack_5d4;
    fVar243 = fStack_5d0;
    fVar216 = fStack_5cc;
    fVar217 = fStack_5c8;
    fVar165 = fStack_5c4;
    if (bVar75 == 0) {
LAB_01d66123:
      auVar264 = ZEXT3264(local_680);
      auVar268 = ZEXT3264(auVar108);
      auVar251 = ZEXT3264(auVar124);
      auVar247 = ZEXT3264(auVar105);
      auVar244 = ZEXT3264(_local_480);
      auVar262 = ZEXT3264(local_7c0);
      auVar256 = ZEXT3264(local_7e0);
      auVar257 = ZEXT3264(local_6e0);
      auVar258 = ZEXT3264(local_700);
      auVar259 = ZEXT3264(local_800);
      auVar260 = ZEXT3264(local_720);
      auVar261 = ZEXT3264(local_820);
      auVar263 = ZEXT3264(local_740);
      auVar265 = ZEXT3264(local_840);
      auVar266 = ZEXT3264(local_760);
      auVar267 = ZEXT3264(local_780);
      auVar269 = ZEXT3264(local_860);
    }
    else {
      auVar116 = _local_540;
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar117 = vaddps_avx512vl(auVar109,auVar109);
      local_420 = vrcp14ps_avx512vl(auVar117);
      auVar108 = vfnmadd213ps_avx512vl(local_420,auVar117,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,local_420,local_420);
      local_6c0 = vxorps_avx512vl(auVar113,auVar94);
      auVar94 = vsubps_avx512vl(local_6c0,auVar114);
      auVar94 = vmulps_avx512vl(auVar94,auVar108);
      auVar114 = vsubps_avx512vl(auVar114,auVar113);
      local_6a0 = vmulps_avx512vl(auVar114,auVar108);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar114,auVar94);
      auVar118._0_4_ =
           (uint)(bVar75 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar108._0_4_;
      bVar9 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar9 * auVar114._4_4_ | (uint)!bVar9 * auVar108._4_4_;
      bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar9 * auVar114._8_4_ | (uint)!bVar9 * auVar108._8_4_;
      bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar9 * auVar114._12_4_ | (uint)!bVar9 * auVar108._12_4_;
      bVar9 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar9 * auVar114._16_4_ | (uint)!bVar9 * auVar108._16_4_;
      bVar9 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar9 * auVar114._20_4_ | (uint)!bVar9 * auVar108._20_4_;
      bVar9 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar9 * auVar114._24_4_ | (uint)!bVar9 * auVar108._24_4_;
      bVar9 = SUB81(uVar79 >> 7,0);
      auVar118._28_4_ = (uint)bVar9 * auVar114._28_4_ | (uint)!bVar9 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar108,local_6a0);
      auVar119._0_4_ =
           (uint)(bVar75 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar108._0_4_;
      bVar9 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar9 * auVar114._4_4_ | (uint)!bVar9 * auVar108._4_4_;
      bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar9 * auVar114._8_4_ | (uint)!bVar9 * auVar108._8_4_;
      bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar9 * auVar114._12_4_ | (uint)!bVar9 * auVar108._12_4_;
      bVar9 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar9 * auVar114._16_4_ | (uint)!bVar9 * auVar108._16_4_;
      bVar9 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar9 * auVar114._20_4_ | (uint)!bVar9 * auVar108._20_4_;
      bVar9 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar9 * auVar114._24_4_ | (uint)!bVar9 * auVar108._24_4_;
      bVar9 = SUB81(uVar79 >> 7,0);
      auVar119._28_4_ = (uint)bVar9 * auVar114._28_4_ | (uint)!bVar9 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar106,auVar108);
      _local_440 = vmaxps_avx512vl(local_240,auVar108);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      local_460 = vmulps_avx512vl(_local_440,auVar34);
      vandps_avx512vl(auVar109,auVar108);
      uVar82 = vcmpps_avx512vl(local_460,local_460,1);
      uVar79 = uVar79 & uVar82;
      bVar78 = (byte)uVar79;
      if (bVar78 != 0) {
        uVar82 = vcmpps_avx512vl(auVar97,_DAT_01faff00,2);
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar97,auVar108);
        bVar8 = (byte)uVar82;
        uVar83 = (uint)(bVar8 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar8 & 1) * local_460._0_4_;
        bVar9 = (bool)((byte)(uVar82 >> 1) & 1);
        uVar133 = (uint)bVar9 * auVar106._4_4_ | (uint)!bVar9 * local_460._4_4_;
        bVar9 = (bool)((byte)(uVar82 >> 2) & 1);
        uVar134 = (uint)bVar9 * auVar106._8_4_ | (uint)!bVar9 * local_460._8_4_;
        bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
        uVar135 = (uint)bVar9 * auVar106._12_4_ | (uint)!bVar9 * local_460._12_4_;
        bVar9 = (bool)((byte)(uVar82 >> 4) & 1);
        uVar136 = (uint)bVar9 * auVar106._16_4_ | (uint)!bVar9 * local_460._16_4_;
        bVar9 = (bool)((byte)(uVar82 >> 5) & 1);
        uVar137 = (uint)bVar9 * auVar106._20_4_ | (uint)!bVar9 * local_460._20_4_;
        bVar9 = (bool)((byte)(uVar82 >> 6) & 1);
        uVar138 = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * local_460._24_4_;
        bVar9 = SUB81(uVar82 >> 7,0);
        uVar139 = (uint)bVar9 * auVar106._28_4_ | (uint)!bVar9 * local_460._28_4_;
        auVar118._0_4_ = (bVar78 & 1) * uVar83 | !(bool)(bVar78 & 1) * auVar118._0_4_;
        bVar9 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar118._4_4_ = bVar9 * uVar133 | !bVar9 * auVar118._4_4_;
        bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar118._8_4_ = bVar9 * uVar134 | !bVar9 * auVar118._8_4_;
        bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar118._12_4_ = bVar9 * uVar135 | !bVar9 * auVar118._12_4_;
        bVar9 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar118._16_4_ = bVar9 * uVar136 | !bVar9 * auVar118._16_4_;
        bVar9 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar118._20_4_ = bVar9 * uVar137 | !bVar9 * auVar118._20_4_;
        bVar9 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar118._24_4_ = bVar9 * uVar138 | !bVar9 * auVar118._24_4_;
        bVar9 = SUB81(uVar79 >> 7,0);
        auVar118._28_4_ = bVar9 * uVar139 | !bVar9 * auVar118._28_4_;
        auVar97 = vblendmps_avx512vl(auVar108,auVar97);
        bVar9 = (bool)((byte)(uVar82 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar82 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar82 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar82 >> 6) & 1);
        bVar16 = SUB81(uVar82 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar78 & 1) * ((uint)(bVar8 & 1) * auVar97._0_4_ | !(bool)(bVar8 & 1) * uVar83)
             | !(bool)(bVar78 & 1) * auVar119._0_4_;
        bVar10 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar10 * ((uint)bVar9 * auVar97._4_4_ | !bVar9 * uVar133) |
             !bVar10 * auVar119._4_4_;
        bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar9 * ((uint)bVar11 * auVar97._8_4_ | !bVar11 * uVar134) |
             !bVar9 * auVar119._8_4_;
        bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar9 * ((uint)bVar12 * auVar97._12_4_ | !bVar12 * uVar135) |
             !bVar9 * auVar119._12_4_;
        bVar9 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar9 * ((uint)bVar13 * auVar97._16_4_ | !bVar13 * uVar136) |
             !bVar9 * auVar119._16_4_;
        bVar9 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar9 * ((uint)bVar14 * auVar97._20_4_ | !bVar14 * uVar137) |
             !bVar9 * auVar119._20_4_;
        bVar9 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar9 * ((uint)bVar15 * auVar97._24_4_ | !bVar15 * uVar138) |
             !bVar9 * auVar119._24_4_;
        bVar9 = SUB81(uVar79 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar9 * ((uint)bVar16 * auVar97._28_4_ | !bVar16 * uVar139) |
             !bVar9 * auVar119._28_4_;
        bVar75 = (~bVar78 | bVar8) & bVar75;
      }
      auVar71._4_4_ = uStack_3dc;
      auVar71._0_4_ = local_3e0;
      auVar71._8_4_ = uStack_3d8;
      auVar71._12_4_ = uStack_3d4;
      auVar71._16_4_ = uStack_3d0;
      auVar71._20_4_ = uStack_3cc;
      auVar71._24_4_ = uStack_3c8;
      auVar71._28_4_ = uStack_3c4;
      if ((bVar75 & 0x7f) == 0) {
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        goto LAB_01d66123;
      }
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar107 = vxorps_avx512vl(auVar107,auVar109);
      auVar92 = vxorps_avx512vl(auVar92,auVar109);
      auVar93 = vxorps_avx512vl(auVar93,auVar109);
      auVar86 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_4f0);
      auVar97 = vbroadcastss_avx512vl(auVar86);
      auVar106 = vmaxps_avx512vl(auVar97,auVar118);
      auVar86 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_4f0);
      auVar97 = vbroadcastss_avx512vl(auVar86);
      auVar114 = vminps_avx512vl(auVar97,auVar119);
      auVar97 = vmulps_avx512vl(auVar55,auVar112);
      auVar97 = vfmadd213ps_avx512vl(auVar111,auVar54,auVar97);
      auVar86 = vfmadd213ps_fma(auVar110,auVar124,auVar97);
      auVar97 = vmulps_avx512vl(auVar71,auVar55);
      auVar264 = ZEXT3264(local_680);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_680,auVar54);
      auVar110 = vfmadd231ps_avx512vl(auVar97,local_360,auVar124);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(auVar249,auVar110);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar97,auVar111,1);
      auVar97 = vxorps_avx512vl(ZEXT1632(auVar86),auVar109);
      auVar112 = vrcp14ps_avx512vl(auVar110);
      auVar120 = vxorps_avx512vl(auVar110,auVar109);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar121 = vfnmadd213ps_avx512vl(auVar112,auVar110,auVar108);
      auVar86 = vfmadd132ps_fma(auVar121,auVar112,auVar112);
      fVar202 = auVar86._0_4_ * auVar97._0_4_;
      fVar222 = auVar86._4_4_ * auVar97._4_4_;
      auVar58._4_4_ = fVar222;
      auVar58._0_4_ = fVar202;
      fVar223 = auVar86._8_4_ * auVar97._8_4_;
      auVar58._8_4_ = fVar223;
      fVar224 = auVar86._12_4_ * auVar97._12_4_;
      auVar58._12_4_ = fVar224;
      fVar225 = auVar97._16_4_ * 0.0;
      auVar58._16_4_ = fVar225;
      fVar141 = auVar97._20_4_ * 0.0;
      auVar58._20_4_ = fVar141;
      fVar160 = auVar97._24_4_ * 0.0;
      auVar58._24_4_ = fVar160;
      auVar58._28_4_ = auVar97._28_4_;
      uVar20 = vcmpps_avx512vl(auVar110,auVar120,1);
      bVar78 = (byte)uVar18 | (byte)uVar20;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar58,auVar121);
      auVar123._0_4_ =
           (uint)(bVar78 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar112._0_4_;
      bVar9 = (bool)(bVar78 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar9 * auVar122._4_4_ | (uint)!bVar9 * auVar112._4_4_;
      bVar9 = (bool)(bVar78 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar9 * auVar122._8_4_ | (uint)!bVar9 * auVar112._8_4_;
      bVar9 = (bool)(bVar78 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar9 * auVar122._12_4_ | (uint)!bVar9 * auVar112._12_4_;
      bVar9 = (bool)(bVar78 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar9 * auVar122._16_4_ | (uint)!bVar9 * auVar112._16_4_;
      bVar9 = (bool)(bVar78 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar9 * auVar122._20_4_ | (uint)!bVar9 * auVar112._20_4_;
      bVar9 = (bool)(bVar78 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar9 * auVar122._24_4_ | (uint)!bVar9 * auVar112._24_4_;
      auVar123._28_4_ =
           (uint)(bVar78 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar112._28_4_;
      auVar124 = vmaxps_avx512vl(auVar106,auVar123);
      uVar20 = vcmpps_avx512vl(auVar110,auVar120,6);
      bVar78 = (byte)uVar18 | (byte)uVar20;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar125._0_4_ =
           (uint)(bVar78 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)fVar202;
      bVar9 = (bool)(bVar78 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar9 * auVar110._4_4_ | (uint)!bVar9 * (int)fVar222;
      bVar9 = (bool)(bVar78 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar9 * auVar110._8_4_ | (uint)!bVar9 * (int)fVar223;
      bVar9 = (bool)(bVar78 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar9 * auVar110._12_4_ | (uint)!bVar9 * (int)fVar224;
      bVar9 = (bool)(bVar78 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar9 * auVar110._16_4_ | (uint)!bVar9 * (int)fVar225;
      bVar9 = (bool)(bVar78 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar9 * auVar110._20_4_ | (uint)!bVar9 * (int)fVar141;
      bVar9 = (bool)(bVar78 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar9 * auVar110._24_4_ | (uint)!bVar9 * (int)fVar160;
      auVar125._28_4_ =
           (uint)(bVar78 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar97._28_4_;
      auVar112 = vminps_avx512vl(auVar114,auVar125);
      auVar97 = vsubps_avx(ZEXT832(0) << 0x20,auVar104);
      auVar104 = vsubps_avx(ZEXT832(0) << 0x20,_local_480);
      auVar114 = ZEXT832(0) << 0x20;
      auVar106 = vsubps_avx(auVar114,auVar105);
      auVar106 = vmulps_avx512vl(auVar106,auVar107);
      auVar104 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar104);
      auVar97 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar97);
      auVar104 = vmulps_avx512vl(auVar71,auVar107);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_680,auVar93);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_360,auVar92);
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar35._16_4_ = 0x7fffffff;
      auVar35._20_4_ = 0x7fffffff;
      auVar35._24_4_ = 0x7fffffff;
      auVar35._28_4_ = 0x7fffffff;
      vandps_avx512vl(auVar104,auVar35);
      uVar18 = vcmpps_avx512vl(auVar104,auVar111,1);
      auVar97 = vxorps_avx512vl(auVar97,auVar109);
      auVar106 = vrcp14ps_avx512vl(auVar104);
      auVar105 = vxorps_avx512vl(auVar104,auVar109);
      auVar92 = vfnmadd213ps_avx512vl(auVar106,auVar104,auVar108);
      auVar86 = vfmadd132ps_fma(auVar92,auVar106,auVar106);
      auVar254 = ZEXT1664(auVar86);
      fVar202 = auVar86._0_4_ * auVar97._0_4_;
      fVar222 = auVar86._4_4_ * auVar97._4_4_;
      auVar59._4_4_ = fVar222;
      auVar59._0_4_ = fVar202;
      fVar223 = auVar86._8_4_ * auVar97._8_4_;
      auVar59._8_4_ = fVar223;
      fVar224 = auVar86._12_4_ * auVar97._12_4_;
      auVar59._12_4_ = fVar224;
      fVar225 = auVar97._16_4_ * 0.0;
      auVar59._16_4_ = fVar225;
      fVar141 = auVar97._20_4_ * 0.0;
      auVar59._20_4_ = fVar141;
      fVar160 = auVar97._24_4_ * 0.0;
      auVar59._24_4_ = fVar160;
      auVar59._28_4_ = auVar97._28_4_;
      uVar20 = vcmpps_avx512vl(auVar104,auVar105,1);
      bVar78 = (byte)uVar18 | (byte)uVar20;
      auVar92 = vblendmps_avx512vl(auVar59,auVar121);
      auVar126._0_4_ =
           (uint)(bVar78 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar106._0_4_;
      bVar9 = (bool)(bVar78 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar9 * auVar92._4_4_ | (uint)!bVar9 * auVar106._4_4_;
      bVar9 = (bool)(bVar78 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar9 * auVar92._8_4_ | (uint)!bVar9 * auVar106._8_4_;
      bVar9 = (bool)(bVar78 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar9 * auVar92._12_4_ | (uint)!bVar9 * auVar106._12_4_;
      bVar9 = (bool)(bVar78 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar9 * auVar92._16_4_ | (uint)!bVar9 * auVar106._16_4_;
      bVar9 = (bool)(bVar78 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar9 * auVar92._20_4_ | (uint)!bVar9 * auVar106._20_4_;
      bVar9 = (bool)(bVar78 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar9 * auVar92._24_4_ | (uint)!bVar9 * auVar106._24_4_;
      auVar126._28_4_ =
           (uint)(bVar78 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar106._28_4_;
      _local_480 = vmaxps_avx(auVar124,auVar126);
      uVar20 = vcmpps_avx512vl(auVar104,auVar105,6);
      bVar78 = (byte)uVar18 | (byte)uVar20;
      auVar127._0_4_ =
           (uint)(bVar78 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)fVar202;
      bVar9 = (bool)(bVar78 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar9 * auVar110._4_4_ | (uint)!bVar9 * (int)fVar222;
      bVar9 = (bool)(bVar78 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar9 * auVar110._8_4_ | (uint)!bVar9 * (int)fVar223;
      bVar9 = (bool)(bVar78 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar9 * auVar110._12_4_ | (uint)!bVar9 * (int)fVar224;
      bVar9 = (bool)(bVar78 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar9 * auVar110._16_4_ | (uint)!bVar9 * (int)fVar225;
      bVar9 = (bool)(bVar78 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar9 * auVar110._20_4_ | (uint)!bVar9 * (int)fVar141;
      bVar9 = (bool)(bVar78 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar9 * auVar110._24_4_ | (uint)!bVar9 * (int)fVar160;
      auVar127._28_4_ =
           (uint)(bVar78 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar97._28_4_;
      local_2e0 = vminps_avx(auVar112,auVar127);
      auVar240 = ZEXT3264(local_2e0);
      auVar97 = _local_480;
      uVar18 = vcmpps_avx512vl(_local_480,local_2e0,2);
      bVar75 = bVar75 & 0x7f & (byte)uVar18;
      if (bVar75 == 0) goto LAB_01d66123;
      auVar104 = vmaxps_avx(auVar114,local_8e0);
      auVar94 = vfmadd213ps_avx512vl(auVar94,auVar115,auVar98);
      auVar94 = vmulps_avx512vl(auVar95,auVar94);
      auVar106 = vfmadd213ps_avx512vl(local_6a0,auVar115,auVar98);
      fVar202 = auVar95._0_4_;
      fVar222 = auVar95._4_4_;
      auVar60._4_4_ = fVar222 * auVar106._4_4_;
      auVar60._0_4_ = fVar202 * auVar106._0_4_;
      fVar223 = auVar95._8_4_;
      auVar60._8_4_ = fVar223 * auVar106._8_4_;
      fVar224 = auVar95._12_4_;
      auVar60._12_4_ = fVar224 * auVar106._12_4_;
      fVar225 = auVar95._16_4_;
      auVar60._16_4_ = fVar225 * auVar106._16_4_;
      fVar141 = auVar95._20_4_;
      auVar60._20_4_ = fVar141 * auVar106._20_4_;
      fVar160 = auVar95._24_4_;
      auVar60._24_4_ = fVar160 * auVar106._24_4_;
      auVar60._28_4_ = auVar106._28_4_;
      auVar94 = vminps_avx512vl(auVar94,auVar108);
      auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar94 = vmaxps_avx(auVar94,ZEXT832(0) << 0x20);
      auVar92 = vminps_avx512vl(auVar60,auVar108);
      auVar61._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar61._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar61._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar61._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar61._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar61._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar61._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar61._28_4_ = auVar94._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar61,local_7a0,local_660);
      auVar94 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar62._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar62._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar62._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar62._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar62._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar62._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar62._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar62._28_4_ = auVar94._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar62,local_7a0,local_660);
      auVar63._4_4_ = auVar104._4_4_ * auVar104._4_4_;
      auVar63._0_4_ = auVar104._0_4_ * auVar104._0_4_;
      auVar63._8_4_ = auVar104._8_4_ * auVar104._8_4_;
      auVar63._12_4_ = auVar104._12_4_ * auVar104._12_4_;
      auVar63._16_4_ = auVar104._16_4_ * auVar104._16_4_;
      auVar63._20_4_ = auVar104._20_4_ * auVar104._20_4_;
      auVar63._24_4_ = auVar104._24_4_ * auVar104._24_4_;
      auVar63._28_4_ = auVar104._28_4_;
      auVar94 = vsubps_avx(local_600,auVar63);
      auVar64._4_4_ = auVar94._4_4_ * (float)local_540._4_4_;
      auVar64._0_4_ = auVar94._0_4_ * (float)local_540._0_4_;
      auVar64._8_4_ = auVar94._8_4_ * fStack_538;
      auVar64._12_4_ = auVar94._12_4_ * fStack_534;
      auVar64._16_4_ = auVar94._16_4_ * fStack_530;
      auVar64._20_4_ = auVar94._20_4_ * fStack_52c;
      auVar64._24_4_ = auVar94._24_4_ * fStack_528;
      auVar64._28_4_ = auVar104._28_4_;
      auVar104 = vsubps_avx(local_520,auVar64);
      uVar79 = vcmpps_avx512vl(auVar104,ZEXT832(0) << 0x20,5);
      auVar260 = ZEXT3264(local_720);
      auVar263 = ZEXT3264(local_740);
      auVar266 = ZEXT3264(local_760);
      auVar267 = ZEXT3264(local_780);
      if ((byte)uVar79 == 0) {
        uVar79 = 0;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar254 = ZEXT864(0) << 0x20;
        auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar244 = ZEXT864(0) << 0x20;
        auVar128._8_4_ = 0x7f800000;
        auVar128._0_8_ = 0x7f8000007f800000;
        auVar128._12_4_ = 0x7f800000;
        auVar128._16_4_ = 0x7f800000;
        auVar128._20_4_ = 0x7f800000;
        auVar128._24_4_ = 0x7f800000;
        auVar128._28_4_ = 0x7f800000;
        auVar129._8_4_ = 0xff800000;
        auVar129._0_8_ = 0xff800000ff800000;
        auVar129._12_4_ = 0xff800000;
        auVar129._16_4_ = 0xff800000;
        auVar129._20_4_ = 0xff800000;
        auVar129._24_4_ = 0xff800000;
        auVar129._28_4_ = 0xff800000;
      }
      else {
        auVar87 = vxorps_avx512vl(auVar143,auVar143);
        uVar82 = vcmpps_avx512vl(auVar104,auVar114,5);
        auVar104 = vsqrtps_avx(auVar104);
        auVar108 = vfnmadd213ps_avx512vl(auVar117,local_420,auVar108);
        auVar106 = vfmadd132ps_avx512vl(auVar108,local_420,local_420);
        auVar108 = vsubps_avx(local_6c0,auVar104);
        auVar93 = vmulps_avx512vl(auVar108,auVar106);
        auVar108 = vsubps_avx512vl(auVar104,auVar113);
        auVar107 = vmulps_avx512vl(auVar108,auVar106);
        auVar108 = vfmadd213ps_avx512vl(auVar115,auVar93,auVar98);
        auVar65._4_4_ = fVar222 * auVar108._4_4_;
        auVar65._0_4_ = fVar202 * auVar108._0_4_;
        auVar65._8_4_ = fVar223 * auVar108._8_4_;
        auVar65._12_4_ = fVar224 * auVar108._12_4_;
        auVar65._16_4_ = fVar225 * auVar108._16_4_;
        auVar65._20_4_ = fVar141 * auVar108._20_4_;
        auVar65._24_4_ = fVar160 * auVar108._24_4_;
        auVar65._28_4_ = auVar92._28_4_;
        auVar108 = vmulps_avx512vl(local_360,auVar93);
        auVar104 = vmulps_avx512vl(local_680,auVar93);
        auVar72._4_4_ = uStack_3dc;
        auVar72._0_4_ = local_3e0;
        auVar72._8_4_ = uStack_3d8;
        auVar72._12_4_ = uStack_3d4;
        auVar72._16_4_ = uStack_3d0;
        auVar72._20_4_ = uStack_3cc;
        auVar72._24_4_ = uStack_3c8;
        auVar72._28_4_ = uStack_3c4;
        auVar106 = vmulps_avx512vl(auVar72,auVar93);
        auVar92 = vfmadd213ps_avx512vl(auVar99,auVar65,auVar101);
        auVar108 = vsubps_avx512vl(auVar108,auVar92);
        auVar92 = vfmadd213ps_avx512vl(auVar100,auVar65,auVar102);
        auVar104 = vsubps_avx512vl(auVar104,auVar92);
        auVar86 = vfmadd213ps_fma(auVar65,auVar96,auVar103);
        auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar86));
        auVar244 = ZEXT3264(auVar106);
        auVar98 = vfmadd213ps_avx512vl(auVar115,auVar107,auVar98);
        auVar66._4_4_ = fVar222 * auVar98._4_4_;
        auVar66._0_4_ = fVar202 * auVar98._0_4_;
        auVar66._8_4_ = fVar223 * auVar98._8_4_;
        auVar66._12_4_ = fVar224 * auVar98._12_4_;
        auVar66._16_4_ = fVar225 * auVar98._16_4_;
        auVar66._20_4_ = fVar141 * auVar98._20_4_;
        auVar66._24_4_ = fVar160 * auVar98._24_4_;
        auVar66._28_4_ = auVar95._28_4_;
        auVar95 = vmulps_avx512vl(local_360,auVar107);
        auVar98 = vmulps_avx512vl(local_680,auVar107);
        auVar92 = vmulps_avx512vl(auVar72,auVar107);
        auVar86 = vfmadd213ps_fma(auVar99,auVar66,auVar101);
        auVar106 = vsubps_avx(auVar95,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar100,auVar66,auVar102);
        auVar95 = vsubps_avx(auVar98,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar96,auVar66,auVar103);
        auVar98 = vsubps_avx512vl(auVar92,ZEXT1632(auVar86));
        auVar254 = ZEXT3264(auVar98);
        auVar151._8_4_ = 0x7f800000;
        auVar151._0_8_ = 0x7f8000007f800000;
        auVar151._12_4_ = 0x7f800000;
        auVar151._16_4_ = 0x7f800000;
        auVar151._20_4_ = 0x7f800000;
        auVar151._24_4_ = 0x7f800000;
        auVar151._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar151,auVar93);
        bVar9 = (bool)((byte)uVar82 & 1);
        auVar128._0_4_ = (uint)bVar9 * auVar98._0_4_ | (uint)!bVar9 * auVar101._0_4_;
        bVar9 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar9 * auVar98._4_4_ | (uint)!bVar9 * auVar101._4_4_;
        bVar9 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar9 * auVar98._8_4_ | (uint)!bVar9 * auVar101._8_4_;
        bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar9 * auVar98._12_4_ | (uint)!bVar9 * auVar101._12_4_;
        bVar9 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar128._16_4_ = (uint)bVar9 * auVar98._16_4_ | (uint)!bVar9 * auVar101._16_4_;
        bVar9 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar128._20_4_ = (uint)bVar9 * auVar98._20_4_ | (uint)!bVar9 * auVar101._20_4_;
        bVar9 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar128._24_4_ = (uint)bVar9 * auVar98._24_4_ | (uint)!bVar9 * auVar101._24_4_;
        bVar9 = SUB81(uVar82 >> 7,0);
        auVar128._28_4_ = (uint)bVar9 * auVar98._28_4_ | (uint)!bVar9 * auVar101._28_4_;
        auVar152._8_4_ = 0xff800000;
        auVar152._0_8_ = 0xff800000ff800000;
        auVar152._12_4_ = 0xff800000;
        auVar152._16_4_ = 0xff800000;
        auVar152._20_4_ = 0xff800000;
        auVar152._24_4_ = 0xff800000;
        auVar152._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar152,auVar107);
        bVar9 = (bool)((byte)uVar82 & 1);
        auVar129._0_4_ = (uint)bVar9 * auVar98._0_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar9 * auVar98._4_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar9 * auVar98._8_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar9 * auVar98._12_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar9 * auVar98._16_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar9 * auVar98._20_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar9 * auVar98._24_4_ | (uint)!bVar9 * -0x800000;
        bVar9 = SUB81(uVar82 >> 7,0);
        auVar129._28_4_ = (uint)bVar9 * auVar98._28_4_ | (uint)!bVar9 * -0x800000;
        auVar36._8_4_ = 0x36000000;
        auVar36._0_8_ = 0x3600000036000000;
        auVar36._12_4_ = 0x36000000;
        auVar36._16_4_ = 0x36000000;
        auVar36._20_4_ = 0x36000000;
        auVar36._24_4_ = 0x36000000;
        auVar36._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(_local_440,auVar36);
        uVar19 = vcmpps_avx512vl(auVar98,local_460,0xe);
        uVar82 = uVar82 & uVar19;
        bVar78 = (byte)uVar82;
        if (bVar78 != 0) {
          uVar19 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar87),2);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          auVar99 = vblendmps_avx512vl(auVar234,auVar250);
          bVar8 = (byte)uVar19;
          uVar83 = (uint)(bVar8 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar98._0_4_;
          bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
          uVar133 = (uint)bVar9 * auVar99._4_4_ | (uint)!bVar9 * auVar98._4_4_;
          bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
          uVar134 = (uint)bVar9 * auVar99._8_4_ | (uint)!bVar9 * auVar98._8_4_;
          bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
          uVar135 = (uint)bVar9 * auVar99._12_4_ | (uint)!bVar9 * auVar98._12_4_;
          bVar9 = (bool)((byte)(uVar19 >> 4) & 1);
          uVar136 = (uint)bVar9 * auVar99._16_4_ | (uint)!bVar9 * auVar98._16_4_;
          bVar9 = (bool)((byte)(uVar19 >> 5) & 1);
          uVar137 = (uint)bVar9 * auVar99._20_4_ | (uint)!bVar9 * auVar98._20_4_;
          bVar9 = (bool)((byte)(uVar19 >> 6) & 1);
          uVar138 = (uint)bVar9 * auVar99._24_4_ | (uint)!bVar9 * auVar98._24_4_;
          bVar9 = SUB81(uVar19 >> 7,0);
          uVar139 = (uint)bVar9 * auVar99._28_4_ | (uint)!bVar9 * auVar98._28_4_;
          auVar128._0_4_ = (bVar78 & 1) * uVar83 | !(bool)(bVar78 & 1) * auVar128._0_4_;
          bVar9 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar128._4_4_ = bVar9 * uVar133 | !bVar9 * auVar128._4_4_;
          bVar9 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar128._8_4_ = bVar9 * uVar134 | !bVar9 * auVar128._8_4_;
          bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar128._12_4_ = bVar9 * uVar135 | !bVar9 * auVar128._12_4_;
          bVar9 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar128._16_4_ = bVar9 * uVar136 | !bVar9 * auVar128._16_4_;
          bVar9 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar128._20_4_ = bVar9 * uVar137 | !bVar9 * auVar128._20_4_;
          bVar9 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar128._24_4_ = bVar9 * uVar138 | !bVar9 * auVar128._24_4_;
          bVar9 = SUB81(uVar82 >> 7,0);
          auVar128._28_4_ = bVar9 * uVar139 | !bVar9 * auVar128._28_4_;
          auVar98 = vblendmps_avx512vl(auVar250,auVar234);
          bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar19 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar19 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar19 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar19 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar19 >> 6) & 1);
          bVar16 = SUB81(uVar19 >> 7,0);
          auVar129._0_4_ =
               (uint)(bVar78 & 1) *
               ((uint)(bVar8 & 1) * auVar98._0_4_ | !(bool)(bVar8 & 1) * uVar83) |
               !(bool)(bVar78 & 1) * auVar129._0_4_;
          bVar10 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar129._4_4_ =
               (uint)bVar10 * ((uint)bVar9 * auVar98._4_4_ | !bVar9 * uVar133) |
               !bVar10 * auVar129._4_4_;
          bVar9 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar129._8_4_ =
               (uint)bVar9 * ((uint)bVar11 * auVar98._8_4_ | !bVar11 * uVar134) |
               !bVar9 * auVar129._8_4_;
          bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar129._12_4_ =
               (uint)bVar9 * ((uint)bVar12 * auVar98._12_4_ | !bVar12 * uVar135) |
               !bVar9 * auVar129._12_4_;
          bVar9 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar129._16_4_ =
               (uint)bVar9 * ((uint)bVar13 * auVar98._16_4_ | !bVar13 * uVar136) |
               !bVar9 * auVar129._16_4_;
          bVar9 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar129._20_4_ =
               (uint)bVar9 * ((uint)bVar14 * auVar98._20_4_ | !bVar14 * uVar137) |
               !bVar9 * auVar129._20_4_;
          bVar9 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar129._24_4_ =
               (uint)bVar9 * ((uint)bVar15 * auVar98._24_4_ | !bVar15 * uVar138) |
               !bVar9 * auVar129._24_4_;
          bVar9 = SUB81(uVar82 >> 7,0);
          auVar129._28_4_ =
               (uint)bVar9 * ((uint)bVar16 * auVar98._28_4_ | !bVar16 * uVar139) |
               !bVar9 * auVar129._28_4_;
          uVar79 = (ulong)(byte)((~bVar78 | bVar8) & (byte)uVar79);
        }
      }
      auVar262 = ZEXT3264(local_7c0);
      auVar256 = ZEXT3264(local_7e0);
      auVar259 = ZEXT3264(local_800);
      auVar261 = ZEXT3264(local_820);
      auVar265 = ZEXT3264(local_840);
      auVar269 = ZEXT3264(local_860);
      uVar142 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar231._4_4_ = uVar142;
      auVar231._0_4_ = uVar142;
      auVar231._8_4_ = uVar142;
      auVar231._12_4_ = uVar142;
      auVar231._16_4_ = uVar142;
      auVar231._20_4_ = uVar142;
      auVar231._24_4_ = uVar142;
      auVar231._28_4_ = uVar142;
      uVar142 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar235._4_4_ = uVar142;
      auVar235._0_4_ = uVar142;
      auVar235._8_4_ = uVar142;
      auVar235._12_4_ = uVar142;
      auVar235._16_4_ = uVar142;
      auVar235._20_4_ = uVar142;
      auVar235._24_4_ = uVar142;
      auVar235._28_4_ = uVar142;
      auVar236 = ZEXT3264(auVar235);
      fVar202 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar251 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(fVar202,
                                                  CONCAT412(fVar202,CONCAT48(fVar202,CONCAT44(
                                                  fVar202,fVar202))))))));
      auVar229._0_4_ = fVar202 * auVar254._0_4_;
      auVar229._4_4_ = fVar202 * auVar254._4_4_;
      auVar229._8_4_ = fVar202 * auVar254._8_4_;
      auVar229._12_4_ = fVar202 * auVar254._12_4_;
      auVar229._16_4_ = fVar202 * auVar254._16_4_;
      auVar229._20_4_ = fVar202 * auVar254._20_4_;
      auVar229._28_36_ = auVar254._28_36_;
      auVar229._24_4_ = fVar202 * auVar254._24_4_;
      auVar86 = vfmadd231ps_fma(auVar229._0_32_,auVar235,auVar95);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar231,auVar106);
      auVar254 = ZEXT3264(_local_480);
      _local_340 = _local_480;
      local_320 = vminps_avx(local_2e0,auVar128);
      auVar246._8_4_ = 0x7fffffff;
      auVar246._0_8_ = 0x7fffffff7fffffff;
      auVar246._12_4_ = 0x7fffffff;
      auVar246._16_4_ = 0x7fffffff;
      auVar246._20_4_ = 0x7fffffff;
      auVar246._24_4_ = 0x7fffffff;
      auVar246._28_4_ = 0x7fffffff;
      auVar247 = ZEXT3264(auVar246);
      auVar95 = vandps_avx(auVar246,ZEXT1632(auVar86));
      local_400 = vmaxps_avx(_local_480,auVar129);
      auVar229 = ZEXT3264(local_400);
      local_300 = local_400;
      auVar155._8_4_ = 0x3e99999a;
      auVar155._0_8_ = 0x3e99999a3e99999a;
      auVar155._12_4_ = 0x3e99999a;
      auVar155._16_4_ = 0x3e99999a;
      auVar155._20_4_ = 0x3e99999a;
      auVar155._24_4_ = 0x3e99999a;
      auVar155._28_4_ = 0x3e99999a;
      uVar18 = vcmpps_avx512vl(auVar95,auVar155,1);
      local_8f2 = (short)uVar18;
      uVar18 = vcmpps_avx512vl(_local_480,local_320,2);
      bVar78 = (byte)uVar18 & bVar75;
      uVar20 = vcmpps_avx512vl(local_400,local_2e0,2);
      auVar257 = ZEXT3264(local_6e0);
      auVar258 = ZEXT3264(local_700);
      if ((bVar75 & ((byte)uVar20 | (byte)uVar18)) == 0) {
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar268 = ZEXT3264(auVar97);
      }
      else {
        auVar67._4_4_ = auVar244._4_4_ * fVar202;
        auVar67._0_4_ = auVar244._0_4_ * fVar202;
        auVar67._8_4_ = auVar244._8_4_ * fVar202;
        auVar67._12_4_ = auVar244._12_4_ * fVar202;
        auVar67._16_4_ = auVar244._16_4_ * fVar202;
        auVar67._20_4_ = auVar244._20_4_ * fVar202;
        auVar67._24_4_ = auVar244._24_4_ * fVar202;
        auVar67._28_4_ = 0x3e99999a;
        auVar86 = vfmadd213ps_fma(auVar104,auVar235,auVar67);
        auVar86 = vfmadd213ps_fma(auVar108,auVar231,ZEXT1632(auVar86));
        auVar95 = vandps_avx(auVar246,ZEXT1632(auVar86));
        uVar18 = vcmpps_avx512vl(auVar95,auVar155,1);
        local_86c = (int)CONCAT71((int7)(uVar79 >> 8),~(byte)uVar79);
        bVar8 = (byte)uVar18 | ~(byte)uVar79;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar95 = vpblendmd_avx512vl(auVar156,auVar37);
        local_2c0._0_4_ = (uint)(bVar8 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar8 & 1) * 2;
        bVar9 = (bool)(bVar8 >> 1 & 1);
        local_2c0._4_4_ = (uint)bVar9 * auVar95._4_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar8 >> 2 & 1);
        local_2c0._8_4_ = (uint)bVar9 * auVar95._8_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar8 >> 3 & 1);
        local_2c0._12_4_ = (uint)bVar9 * auVar95._12_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar8 >> 4 & 1);
        local_2c0._16_4_ = (uint)bVar9 * auVar95._16_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar8 >> 5 & 1);
        local_2c0._20_4_ = (uint)bVar9 * auVar95._20_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar8 >> 6 & 1);
        local_2c0._24_4_ = (uint)bVar9 * auVar95._24_4_ | (uint)!bVar9 * 2;
        local_2c0._28_4_ = (uint)(bVar8 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar8 >> 7) * 2;
        local_380 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_380,local_2c0,5);
        local_868 = (uint)bVar78;
        bVar78 = (byte)uVar18 & bVar78;
        _local_540 = auVar116;
        if (bVar78 == 0) {
          fVar203 = (ray->super_RayK<1>).tfar;
          auVar158._4_4_ = fVar203;
          auVar158._0_4_ = fVar203;
          auVar158._8_4_ = fVar203;
          auVar158._12_4_ = fVar203;
          auVar158._16_4_ = fVar203;
          auVar158._20_4_ = fVar203;
          auVar158._24_4_ = fVar203;
          auVar158._28_4_ = fVar203;
        }
        else {
          auVar87 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar86 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar3 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar91 = vminps_avx(auVar87,auVar3);
          auVar87 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar3 = vmaxps_avx(auVar86,auVar87);
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar91,auVar181);
          auVar87 = vandps_avx(auVar3,auVar181);
          auVar86 = vmaxps_avx(auVar86,auVar87);
          auVar87 = vmovshdup_avx(auVar86);
          auVar87 = vmaxss_avx(auVar87,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar87);
          fVar203 = auVar86._0_4_ * 1.9073486e-06;
          local_4e0 = vshufps_avx(auVar3,auVar3,0xff);
          local_3c0 = (float)local_480._0_4_ + (float)local_5e0._0_4_;
          fStack_3bc = (float)local_480._4_4_ + (float)local_5e0._4_4_;
          fStack_3b8 = fStack_478 + fStack_5d8;
          fStack_3b4 = fStack_474 + fStack_5d4;
          fStack_3b0 = fStack_470 + fStack_5d0;
          fStack_3ac = fStack_46c + fStack_5cc;
          fStack_3a8 = fStack_468 + fStack_5c8;
          fStack_3a4 = fStack_464 + fStack_5c4;
          _local_480 = auVar97;
          do {
            auVar98 = local_8e0;
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar157,_local_480);
            auVar131._0_4_ =
                 (uint)(bVar78 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar9 * auVar97._4_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar9 * auVar97._8_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar9 * auVar97._12_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar9 * auVar97._16_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar9 * auVar97._20_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 6 & 1);
            auVar131._24_4_ = (uint)bVar9 * auVar97._24_4_ | (uint)!bVar9 * 0x7f800000;
            auVar131._28_4_ =
                 (uint)(bVar78 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
            auVar97 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar97 = vminps_avx(auVar131,auVar97);
            auVar95 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar95);
            auVar95 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar95);
            uVar18 = vcmpps_avx512vl(auVar131,auVar97,0);
            bVar76 = (byte)uVar18 & bVar78;
            bVar8 = bVar78;
            if (bVar76 != 0) {
              bVar8 = bVar76;
            }
            iVar22 = 0;
            for (uVar83 = (uint)bVar8; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_520._0_16_ = (undefined1  [16])aVar1;
            auVar86 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar86._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar78;
              local_8e0._2_30_ = auVar98._2_30_;
              local_660._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar22 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar22 << 2)));
              fVar140 = sqrtf(auVar86._0_4_);
              bVar78 = local_8e0[0];
              auVar86 = local_7a0._0_16_;
              auVar87 = local_660._0_16_;
            }
            else {
              auVar86 = vsqrtss_avx(auVar86,auVar86);
              fVar140 = auVar86._0_4_;
              auVar86 = ZEXT416(*(uint *)(local_340 + (uint)(iVar22 << 2)));
              auVar87 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar22 << 2)));
            }
            auVar86 = vinsertps_avx(auVar86,auVar87,0x10);
            auVar244 = ZEXT1664(auVar86);
            lVar80 = 5;
            do {
              uVar142 = auVar244._0_4_;
              auVar145._4_4_ = uVar142;
              auVar145._0_4_ = uVar142;
              auVar145._8_4_ = uVar142;
              auVar145._12_4_ = uVar142;
              auVar87 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_520._0_16_);
              _local_540 = auVar244._0_16_;
              auVar86 = vmovshdup_avx(auVar244._0_16_);
              fVar217 = auVar86._0_4_;
              fVar216 = 1.0 - fVar217;
              fVar243 = fVar216 * fVar216 * fVar216;
              fVar241 = fVar217 * fVar217;
              fVar165 = fVar241 * fVar217;
              auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                       ZEXT416((uint)fVar165));
              fVar242 = fVar217 * fVar216;
              local_660._0_16_ = ZEXT416((uint)fVar216);
              local_8e0._0_16_ = auVar86;
              auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar217 * 6.0)),
                                        ZEXT416((uint)(fVar242 * fVar216)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar165),
                                        ZEXT416((uint)fVar243));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar216 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar242 * fVar217)));
              fVar243 = fVar243 * 0.16666667;
              fVar216 = (auVar3._0_4_ + auVar91._0_4_) * 0.16666667;
              fVar217 = (auVar86._0_4_ + auVar84._0_4_) * 0.16666667;
              fVar165 = fVar165 * 0.16666667;
              auVar182._0_4_ = fVar165 * (float)local_5c0._0_4_;
              auVar182._4_4_ = fVar165 * (float)local_5c0._4_4_;
              auVar182._8_4_ = fVar165 * fStack_5b8;
              auVar182._12_4_ = fVar165 * fStack_5b4;
              auVar218._4_4_ = fVar217;
              auVar218._0_4_ = fVar217;
              auVar218._8_4_ = fVar217;
              auVar218._12_4_ = fVar217;
              auVar86 = vfmadd132ps_fma(auVar218,auVar182,local_580._0_16_);
              auVar183._4_4_ = fVar216;
              auVar183._0_4_ = fVar216;
              auVar183._8_4_ = fVar216;
              auVar183._12_4_ = fVar216;
              auVar86 = vfmadd132ps_fma(auVar183,auVar86,local_5a0._0_16_);
              auVar167._4_4_ = fVar243;
              auVar167._0_4_ = fVar243;
              auVar167._8_4_ = fVar243;
              auVar167._12_4_ = fVar243;
              auVar86 = vfmadd132ps_fma(auVar167,auVar86,local_560._0_16_);
              local_420._0_16_ = auVar86;
              auVar86 = vsubps_avx(auVar87,auVar86);
              local_7a0._0_16_ = auVar86;
              auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
              local_600._0_16_ = auVar86;
              if (auVar86._0_4_ < 0.0) {
                local_6a0._0_4_ = fVar241;
                local_6c0._0_4_ = fVar242;
                auVar251._0_4_ = sqrtf(auVar86._0_4_);
                auVar251._4_60_ = extraout_var;
                auVar86 = auVar251._0_16_;
                fVar242 = (float)local_6c0._0_4_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                local_6a0._0_4_ = fVar241;
              }
              local_440._4_4_ = local_660._0_4_;
              local_440._0_4_ = local_440._4_4_;
              fStack_438 = (float)local_440._4_4_;
              fStack_434 = (float)local_440._4_4_;
              auVar3 = vfnmsub213ss_fma(local_8e0._0_16_,local_8e0._0_16_,
                                        ZEXT416((uint)(fVar242 * 4.0)));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * 4.0)),local_660._0_16_,
                                        local_660._0_16_);
              fVar241 = (float)local_440._4_4_ * -(float)local_440._4_4_ * 0.5;
              fVar242 = auVar3._0_4_ * 0.5;
              fVar243 = auVar87._0_4_ * 0.5;
              local_6a0._0_4_ = (float)local_6a0._0_4_ * 0.5;
              auVar204._0_4_ = (float)local_6a0._0_4_ * (float)local_5c0._0_4_;
              auVar204._4_4_ = (float)local_6a0._0_4_ * (float)local_5c0._4_4_;
              auVar204._8_4_ = (float)local_6a0._0_4_ * fStack_5b8;
              auVar204._12_4_ = (float)local_6a0._0_4_ * fStack_5b4;
              auVar168._4_4_ = fVar243;
              auVar168._0_4_ = fVar243;
              auVar168._8_4_ = fVar243;
              auVar168._12_4_ = fVar243;
              auVar87 = vfmadd132ps_fma(auVar168,auVar204,local_580._0_16_);
              auVar184._4_4_ = fVar242;
              auVar184._0_4_ = fVar242;
              auVar184._8_4_ = fVar242;
              auVar184._12_4_ = fVar242;
              auVar87 = vfmadd132ps_fma(auVar184,auVar87,local_5a0._0_16_);
              auVar252._4_4_ = fVar241;
              auVar252._0_4_ = fVar241;
              auVar252._8_4_ = fVar241;
              auVar252._12_4_ = fVar241;
              local_6a0._0_16_ = vfmadd132ps_fma(auVar252,auVar87,local_560._0_16_);
              local_460._0_16_ = vdpps_avx(local_6a0._0_16_,local_6a0._0_16_,0x7f);
              auVar68._12_4_ = 0;
              auVar68._0_12_ = ZEXT812(0);
              fVar241 = local_460._0_4_;
              _local_8b0 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar241));
              fVar242 = local_8b0._0_4_;
              local_4a0 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar241));
              auVar87 = vfnmadd213ss_fma(local_4a0,local_460._0_16_,ZEXT416(0x40000000));
              local_6c0._0_4_ = auVar86._0_4_;
              if (fVar241 < -fVar241) {
                local_8c0._0_4_ = fVar241 * -0.5;
                fVar243 = sqrtf(fVar241);
                auVar86 = ZEXT416((uint)local_6c0._0_4_);
                fVar241 = (float)local_8c0._0_4_;
                auVar3 = local_6a0._0_16_;
              }
              else {
                auVar3 = vsqrtss_avx(local_460._0_16_,local_460._0_16_);
                fVar243 = auVar3._0_4_;
                fVar241 = fVar241 * -0.5;
                auVar3 = local_6a0._0_16_;
              }
              fVar216 = local_8b0._0_4_;
              fVar241 = fVar242 * 1.5 + fVar241 * fVar216 * fVar216 * fVar216;
              local_8b0._0_4_ = auVar3._0_4_ * fVar241;
              local_8b0._4_4_ = auVar3._4_4_ * fVar241;
              fStack_8a8 = auVar3._8_4_ * fVar241;
              fStack_8a4 = auVar3._12_4_ * fVar241;
              auVar91 = vdpps_avx(local_7a0._0_16_,_local_8b0,0x7f);
              fVar216 = auVar86._0_4_;
              auVar146._0_4_ = auVar91._0_4_ * auVar91._0_4_;
              auVar146._4_4_ = auVar91._4_4_ * auVar91._4_4_;
              auVar146._8_4_ = auVar91._8_4_ * auVar91._8_4_;
              auVar146._12_4_ = auVar91._12_4_ * auVar91._12_4_;
              auVar84 = vsubps_avx(local_600._0_16_,auVar146);
              fVar242 = auVar84._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar242;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              auVar85 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
              auVar89 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              if (fVar242 < 0.0) {
                local_4c0._0_4_ = auVar89._0_4_;
                local_8c0 = auVar91;
                local_4d0 = fVar241;
                fStack_4cc = fVar241;
                fStack_4c8 = fVar241;
                fStack_4c4 = fVar241;
                local_4b0 = auVar88;
                fVar242 = sqrtf(fVar242);
                auVar89 = ZEXT416((uint)local_4c0._0_4_);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar86 = ZEXT416((uint)local_6c0._0_4_);
                auVar88 = local_4b0;
                auVar3 = local_6a0._0_16_;
                auVar91 = local_8c0;
                fVar241 = local_4d0;
                fVar217 = fStack_4cc;
                fVar165 = fStack_4c8;
                fVar202 = fStack_4c4;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar242 = auVar84._0_4_;
                fVar217 = fVar241;
                fVar165 = fVar241;
                fVar202 = fVar241;
              }
              auVar254 = ZEXT1664(auVar3);
              auVar251 = ZEXT1664(local_600._0_16_);
              auVar247 = ZEXT1664(local_7a0._0_16_);
              auVar264 = ZEXT3264(local_680);
              auVar262 = ZEXT3264(local_7c0);
              auVar256 = ZEXT3264(local_7e0);
              auVar257 = ZEXT3264(local_6e0);
              auVar258 = ZEXT3264(local_700);
              auVar259 = ZEXT3264(local_800);
              auVar260 = ZEXT3264(local_720);
              auVar261 = ZEXT3264(local_820);
              auVar263 = ZEXT3264(local_740);
              auVar265 = ZEXT3264(local_840);
              auVar266 = ZEXT3264(local_760);
              auVar267 = ZEXT3264(local_780);
              auVar269 = ZEXT3264(local_860);
              auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_660._0_16_,
                                       local_8e0._0_16_);
              auVar17 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_660._0_16_);
              auVar84 = vshufps_avx(_local_540,_local_540,0x55);
              auVar185._0_4_ = auVar84._0_4_ * (float)local_5c0._0_4_;
              auVar185._4_4_ = auVar84._4_4_ * (float)local_5c0._4_4_;
              auVar185._8_4_ = auVar84._8_4_ * fStack_5b8;
              auVar185._12_4_ = auVar84._12_4_ * fStack_5b4;
              auVar205._0_4_ = auVar17._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar84 = vfmadd132ps_fma(auVar205,auVar185,local_580._0_16_);
              auVar170._0_4_ = auVar4._0_4_;
              auVar170._4_4_ = auVar170._0_4_;
              auVar170._8_4_ = auVar170._0_4_;
              auVar170._12_4_ = auVar170._0_4_;
              auVar84 = vfmadd132ps_fma(auVar170,auVar84,local_5a0._0_16_);
              auVar84 = vfmadd132ps_fma(_local_440,auVar84,local_560._0_16_);
              auVar171._0_4_ = auVar84._0_4_ * (float)local_460._0_4_;
              auVar171._4_4_ = auVar84._4_4_ * (float)local_460._0_4_;
              auVar171._8_4_ = auVar84._8_4_ * (float)local_460._0_4_;
              auVar171._12_4_ = auVar84._12_4_ * (float)local_460._0_4_;
              auVar84 = vdpps_avx(auVar3,auVar84,0x7f);
              fVar222 = auVar84._0_4_;
              auVar186._0_4_ = auVar3._0_4_ * fVar222;
              auVar186._4_4_ = auVar3._4_4_ * fVar222;
              auVar186._8_4_ = auVar3._8_4_ * fVar222;
              auVar186._12_4_ = auVar3._12_4_ * fVar222;
              auVar84 = vsubps_avx(auVar171,auVar186);
              fVar222 = auVar87._0_4_ * (float)local_4a0._0_4_;
              auVar4 = vmaxss_avx(ZEXT416((uint)fVar203),
                                  ZEXT416((uint)(local_540._0_4_ * fVar140 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar3,auVar23);
              auVar187._0_4_ = fVar241 * auVar84._0_4_ * fVar222;
              auVar187._4_4_ = fVar217 * auVar84._4_4_ * fVar222;
              auVar187._8_4_ = fVar165 * auVar84._8_4_ * fVar222;
              auVar187._12_4_ = fVar202 * auVar84._12_4_ * fVar222;
              auVar87 = vdpps_avx(auVar90,_local_8b0,0x7f);
              auVar84 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar203),auVar4);
              auVar86 = vdpps_avx(local_7a0._0_16_,auVar187,0x7f);
              auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar216 + 1.0)),
                                        ZEXT416((uint)(fVar203 / fVar243)),auVar84);
              fVar241 = auVar87._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_520._0_16_,_local_8b0,0x7f);
              auVar87 = vdpps_avx(local_7a0._0_16_,auVar90,0x7f);
              auVar84 = vmulss_avx512f(auVar89,auVar88);
              auVar89 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar84._0_4_ *
                                                             auVar88._0_4_ * auVar88._0_4_)));
              auVar84 = vdpps_avx(local_7a0._0_16_,local_520._0_16_,0x7f);
              auVar85 = vfnmadd231ss_fma(auVar87,auVar91,ZEXT416((uint)fVar241));
              auVar84 = vfnmadd231ss_fma(auVar84,auVar91,auVar86);
              auVar87 = vpermilps_avx(local_420._0_16_,0xff);
              fVar242 = fVar242 - auVar87._0_4_;
              auVar88 = vshufps_avx(auVar3,auVar3,0xff);
              auVar87 = vfmsub213ss_fma(auVar85,auVar89,auVar88);
              auVar238._8_4_ = 0x80000000;
              auVar238._0_8_ = 0x8000000080000000;
              auVar238._12_4_ = 0x80000000;
              auVar240 = ZEXT1664(auVar238);
              auVar232._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar232);
              auVar84 = ZEXT416((uint)(auVar84._0_4_ * auVar89._0_4_));
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                        ZEXT416((uint)fVar241),auVar84);
              auVar87 = vinsertps_avx(auVar232,auVar84,0x1c);
              auVar227._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar84 = vinsertps_avx(ZEXT416((uint)fVar241),auVar227,0x10);
              auVar206._0_4_ = auVar85._0_4_;
              auVar206._4_4_ = auVar206._0_4_;
              auVar206._8_4_ = auVar206._0_4_;
              auVar206._12_4_ = auVar206._0_4_;
              auVar86 = vdivps_avx(auVar87,auVar206);
              auVar87 = vdivps_avx(auVar84,auVar206);
              fVar241 = auVar91._0_4_;
              auVar229 = ZEXT1664(CONCAT412(fVar242,CONCAT48(fVar242,CONCAT44(fVar242,fVar242))));
              auVar207._0_4_ = fVar241 * auVar86._0_4_ + fVar242 * auVar87._0_4_;
              auVar207._4_4_ = fVar241 * auVar86._4_4_ + fVar242 * auVar87._4_4_;
              auVar207._8_4_ = fVar241 * auVar86._8_4_ + fVar242 * auVar87._8_4_;
              auVar207._12_4_ = fVar241 * auVar86._12_4_ + fVar242 * auVar87._12_4_;
              auVar86 = vsubps_avx(_local_540,auVar207);
              auVar244 = ZEXT1664(auVar86);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx512vl(auVar91,auVar24);
              if (auVar87._0_4_ < auVar17._0_4_) {
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ + auVar4._0_4_)),local_4e0,
                                          ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar91 = vandps_avx512vl(ZEXT416((uint)fVar242),auVar25);
                if (auVar91._0_4_ < auVar87._0_4_) {
                  fVar140 = auVar86._0_4_ + (float)local_4f0._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar140) &&
                     (fVar241 = (ray->super_RayK<1>).tfar, fVar140 <= fVar241)) {
                    auVar87 = vmovshdup_avx(auVar86);
                    fVar242 = auVar87._0_4_;
                    if ((0.0 <= fVar242) && (fVar242 <= 1.0)) {
                      auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_600._0_4_)
                                                  );
                      fVar216 = auVar87._0_4_;
                      fVar243 = local_600._0_4_ * -0.5;
                      auVar229 = ZEXT464((uint)fVar243);
                      pGVar6 = (context->scene->geometries).items[local_8f0].ptr;
                      if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar243 = fVar216 * 1.5 + fVar243 * fVar216 * fVar216 * fVar216;
                        auVar208._0_4_ = local_7a0._0_4_ * fVar243;
                        auVar208._4_4_ = local_7a0._4_4_ * fVar243;
                        auVar208._8_4_ = local_7a0._8_4_ * fVar243;
                        auVar208._12_4_ = local_7a0._12_4_ * fVar243;
                        auVar88 = vfmadd213ps_fma(auVar88,auVar208,auVar3);
                        auVar87 = vshufps_avx(auVar208,auVar208,0xc9);
                        auVar91 = vshufps_avx(auVar3,auVar3,0xc9);
                        auVar209._0_4_ = auVar208._0_4_ * auVar91._0_4_;
                        auVar209._4_4_ = auVar208._4_4_ * auVar91._4_4_;
                        auVar209._8_4_ = auVar208._8_4_ * auVar91._8_4_;
                        auVar209._12_4_ = auVar208._12_4_ * auVar91._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar209,auVar3,auVar87);
                        auVar87 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar91 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar229 = ZEXT1664(auVar91);
                        auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                        auVar147._0_4_ = auVar88._0_4_ * auVar84._0_4_;
                        auVar147._4_4_ = auVar88._4_4_ * auVar84._4_4_;
                        auVar147._8_4_ = auVar88._8_4_ * auVar84._8_4_;
                        auVar147._12_4_ = auVar88._12_4_ * auVar84._12_4_;
                        auVar87 = vfmsub231ps_fma(auVar147,auVar87,auVar91);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar140;
                          auVar86 = vshufps_avx(auVar87,auVar87,0xe9);
                          uVar18 = vmovlps_avx(auVar86);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar18;
                          (ray->Ng).field_0.field_0.z = auVar87._0_4_;
                          ray->u = fVar242;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8e8;
                          ray->geomID = (uint)local_8f0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8e0._0_4_ = fVar241;
                          auVar84 = vshufps_avx(auVar87,auVar87,0xe9);
                          local_630 = vmovlps_avx(auVar84);
                          local_628 = auVar87._0_4_;
                          local_624 = fVar242;
                          local_620 = 0;
                          local_61c = (uint)local_8e8;
                          local_618 = (uint)local_8f0;
                          local_614 = context->user->instID[0];
                          local_610 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar140;
                          local_8f8 = -1;
                          local_8a0.valid = &local_8f8;
                          local_8a0.geometryUserPtr = pGVar6->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_630;
                          local_8a0.N = 1;
                          if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d66e40:
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar229 = ZEXT1664(auVar229._0_16_);
                              auVar236 = ZEXT1664(auVar236._0_16_);
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar244 = ZEXT1664(auVar244._0_16_);
                              auVar247 = ZEXT1664(auVar247._0_16_);
                              auVar251 = ZEXT1664(auVar251._0_16_);
                              auVar254 = ZEXT1664(auVar254._0_16_);
                              (*p_Var7)(&local_8a0);
                              auVar269 = ZEXT3264(local_860);
                              auVar267 = ZEXT3264(local_780);
                              auVar266 = ZEXT3264(local_760);
                              auVar265 = ZEXT3264(local_840);
                              auVar263 = ZEXT3264(local_740);
                              auVar261 = ZEXT3264(local_820);
                              auVar260 = ZEXT3264(local_720);
                              auVar259 = ZEXT3264(local_800);
                              auVar258 = ZEXT3264(local_700);
                              auVar257 = ZEXT3264(local_6e0);
                              auVar256 = ZEXT3264(local_7e0);
                              auVar262 = ZEXT3264(local_7c0);
                              auVar264 = ZEXT3264(local_680);
                              if (*local_8a0.valid == 0) goto LAB_01d66f47;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            auVar229 = ZEXT1664(auVar91);
                            auVar236 = ZEXT1664(auVar232);
                            auVar240 = ZEXT1664(auVar238);
                            auVar244 = ZEXT1664(auVar86);
                            auVar247 = ZEXT1664(local_7a0._0_16_);
                            auVar251 = ZEXT1664(local_600._0_16_);
                            auVar254 = ZEXT1664(auVar3);
                            (*pGVar6->intersectionFilterN)(&local_8a0);
                            auVar269 = ZEXT3264(local_860);
                            auVar267 = ZEXT3264(local_780);
                            auVar266 = ZEXT3264(local_760);
                            auVar265 = ZEXT3264(local_840);
                            auVar263 = ZEXT3264(local_740);
                            auVar261 = ZEXT3264(local_820);
                            auVar260 = ZEXT3264(local_720);
                            auVar259 = ZEXT3264(local_800);
                            auVar258 = ZEXT3264(local_700);
                            auVar257 = ZEXT3264(local_6e0);
                            auVar256 = ZEXT3264(local_7e0);
                            auVar262 = ZEXT3264(local_7c0);
                            auVar264 = ZEXT3264(local_680);
                            if (*local_8a0.valid != 0) goto LAB_01d66e40;
LAB_01d66f47:
                            (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar80 = lVar80 + -1;
            } while (lVar80 != 0);
            fVar140 = (ray->super_RayK<1>).tfar;
            auVar158._4_4_ = fVar140;
            auVar158._0_4_ = fVar140;
            auVar158._8_4_ = fVar140;
            auVar158._12_4_ = fVar140;
            auVar158._16_4_ = fVar140;
            auVar158._20_4_ = fVar140;
            auVar158._24_4_ = fVar140;
            auVar158._28_4_ = fVar140;
            auVar73._4_4_ = fStack_3bc;
            auVar73._0_4_ = local_3c0;
            auVar73._8_4_ = fStack_3b8;
            auVar73._12_4_ = fStack_3b4;
            auVar73._16_4_ = fStack_3b0;
            auVar73._20_4_ = fStack_3ac;
            auVar73._24_4_ = fStack_3a8;
            auVar73._28_4_ = fStack_3a4;
            uVar18 = vcmpps_avx512vl(auVar158,auVar73,0xd);
            bVar78 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar78 & (byte)uVar18;
          } while (bVar78 != 0);
        }
        bVar78 = (byte)local_8f2 | (byte)local_86c;
        auVar178._0_4_ = (float)local_5e0._0_4_ + local_400._0_4_;
        auVar178._4_4_ = (float)local_5e0._4_4_ + local_400._4_4_;
        auVar178._8_4_ = fStack_5d8 + local_400._8_4_;
        auVar178._12_4_ = fStack_5d4 + local_400._12_4_;
        auVar178._16_4_ = fStack_5d0 + local_400._16_4_;
        auVar178._20_4_ = fStack_5cc + local_400._20_4_;
        auVar178._24_4_ = fStack_5c8 + local_400._24_4_;
        auVar178._28_4_ = fStack_5c4 + local_400._28_4_;
        uVar18 = vcmpps_avx512vl(auVar178,auVar158,2);
        bVar75 = (byte)uVar20 & bVar75 & (byte)uVar18;
        auVar179._8_4_ = 2;
        auVar179._0_8_ = 0x200000002;
        auVar179._12_4_ = 2;
        auVar179._16_4_ = 2;
        auVar179._20_4_ = 2;
        auVar179._24_4_ = 2;
        auVar179._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar179,auVar38);
        local_400._0_4_ = (uint)(bVar78 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
        bVar9 = (bool)(bVar78 >> 1 & 1);
        local_400._4_4_ = (uint)bVar9 * auVar97._4_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar78 >> 2 & 1);
        local_400._8_4_ = (uint)bVar9 * auVar97._8_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar78 >> 3 & 1);
        local_400._12_4_ = (uint)bVar9 * auVar97._12_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar78 >> 4 & 1);
        local_400._16_4_ = (uint)bVar9 * auVar97._16_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar78 >> 5 & 1);
        local_400._20_4_ = (uint)bVar9 * auVar97._20_4_ | (uint)!bVar9 * 2;
        bVar9 = (bool)(bVar78 >> 6 & 1);
        local_400._24_4_ = (uint)bVar9 * auVar97._24_4_ | (uint)!bVar9 * 2;
        local_400._28_4_ = (uint)(bVar78 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar78 >> 7) * 2;
        uVar18 = vpcmpd_avx512vl(local_380,local_400,5);
        bVar78 = (byte)uVar18 & bVar75;
        fVar203 = (float)local_5e0._0_4_;
        fVar140 = (float)local_5e0._4_4_;
        fVar241 = fStack_5d8;
        fVar242 = fStack_5d4;
        fVar243 = fStack_5d0;
        fVar216 = fStack_5cc;
        fVar217 = fStack_5c8;
        fVar165 = fStack_5c4;
        if (bVar78 != 0) {
          auVar87 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar86 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar3 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar91 = vminps_avx(auVar87,auVar3);
          auVar87 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar3 = vmaxps_avx(auVar86,auVar87);
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar91,auVar188);
          auVar87 = vandps_avx(auVar3,auVar188);
          auVar86 = vmaxps_avx(auVar86,auVar87);
          auVar87 = vmovshdup_avx(auVar86);
          auVar87 = vmaxss_avx(auVar87,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar87);
          fVar203 = auVar86._0_4_ * 1.9073486e-06;
          local_4e0 = vshufps_avx(auVar3,auVar3,0xff);
          local_3c0 = (float)local_5e0._0_4_ + local_300._0_4_;
          fStack_3bc = (float)local_5e0._4_4_ + local_300._4_4_;
          fStack_3b8 = fStack_5d8 + local_300._8_4_;
          fStack_3b4 = fStack_5d4 + local_300._12_4_;
          fStack_3b0 = fStack_5d0 + local_300._16_4_;
          fStack_3ac = fStack_5cc + local_300._20_4_;
          fStack_3a8 = fStack_5c8 + local_300._24_4_;
          fStack_3a4 = fStack_5c4 + local_300._28_4_;
          _local_480 = local_300;
          do {
            auVar98 = local_8e0;
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar159,_local_480);
            auVar132._0_4_ =
                 (uint)(bVar78 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar9 * auVar97._4_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar9 * auVar97._8_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar9 * auVar97._12_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar9 * auVar97._16_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar9 * auVar97._20_4_ | (uint)!bVar9 * 0x7f800000;
            bVar9 = (bool)(bVar78 >> 6 & 1);
            auVar132._24_4_ = (uint)bVar9 * auVar97._24_4_ | (uint)!bVar9 * 0x7f800000;
            auVar132._28_4_ =
                 (uint)(bVar78 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
            auVar97 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar97 = vminps_avx(auVar132,auVar97);
            auVar95 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar95);
            auVar95 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar95);
            uVar18 = vcmpps_avx512vl(auVar132,auVar97,0);
            bVar76 = (byte)uVar18 & bVar78;
            bVar8 = bVar78;
            if (bVar76 != 0) {
              bVar8 = bVar76;
            }
            iVar22 = 0;
            for (uVar83 = (uint)bVar8; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_520._0_16_ = (undefined1  [16])aVar1;
            auVar86 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar86._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar78;
              local_8e0._2_30_ = auVar98._2_30_;
              local_660._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar22 << 2)));
              fVar140 = sqrtf(auVar86._0_4_);
              bVar78 = local_8e0[0];
              auVar86 = local_7a0._0_16_;
              auVar87 = local_660._0_16_;
            }
            else {
              auVar86 = vsqrtss_avx(auVar86,auVar86);
              fVar140 = auVar86._0_4_;
              auVar86 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar22 << 2)));
              auVar87 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
            }
            auVar86 = vinsertps_avx(auVar86,auVar87,0x10);
            auVar244 = ZEXT1664(auVar86);
            lVar80 = 5;
            do {
              uVar142 = auVar244._0_4_;
              auVar148._4_4_ = uVar142;
              auVar148._0_4_ = uVar142;
              auVar148._8_4_ = uVar142;
              auVar148._12_4_ = uVar142;
              auVar87 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_520._0_16_);
              _local_540 = auVar244._0_16_;
              auVar86 = vmovshdup_avx(auVar244._0_16_);
              fVar217 = auVar86._0_4_;
              fVar216 = 1.0 - fVar217;
              fVar243 = fVar216 * fVar216 * fVar216;
              fVar241 = fVar217 * fVar217;
              fVar165 = fVar241 * fVar217;
              auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                       ZEXT416((uint)fVar165));
              fVar242 = fVar217 * fVar216;
              local_660._0_16_ = ZEXT416((uint)fVar216);
              local_8e0._0_16_ = auVar86;
              auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar217 * 6.0)),
                                        ZEXT416((uint)(fVar242 * fVar216)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar165),
                                        ZEXT416((uint)fVar243));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar216 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar242 * fVar217)));
              fVar243 = fVar243 * 0.16666667;
              fVar216 = (auVar3._0_4_ + auVar91._0_4_) * 0.16666667;
              fVar217 = (auVar86._0_4_ + auVar84._0_4_) * 0.16666667;
              fVar165 = fVar165 * 0.16666667;
              auVar189._0_4_ = fVar165 * (float)local_5c0._0_4_;
              auVar189._4_4_ = fVar165 * (float)local_5c0._4_4_;
              auVar189._8_4_ = fVar165 * fStack_5b8;
              auVar189._12_4_ = fVar165 * fStack_5b4;
              auVar219._4_4_ = fVar217;
              auVar219._0_4_ = fVar217;
              auVar219._8_4_ = fVar217;
              auVar219._12_4_ = fVar217;
              auVar86 = vfmadd132ps_fma(auVar219,auVar189,local_580._0_16_);
              auVar190._4_4_ = fVar216;
              auVar190._0_4_ = fVar216;
              auVar190._8_4_ = fVar216;
              auVar190._12_4_ = fVar216;
              auVar86 = vfmadd132ps_fma(auVar190,auVar86,local_5a0._0_16_);
              auVar172._4_4_ = fVar243;
              auVar172._0_4_ = fVar243;
              auVar172._8_4_ = fVar243;
              auVar172._12_4_ = fVar243;
              auVar86 = vfmadd132ps_fma(auVar172,auVar86,local_560._0_16_);
              local_420._0_16_ = auVar86;
              auVar86 = vsubps_avx(auVar87,auVar86);
              local_7a0._0_16_ = auVar86;
              auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
              local_600._0_16_ = auVar86;
              if (auVar86._0_4_ < 0.0) {
                local_6a0._0_4_ = fVar241;
                local_6c0._0_4_ = fVar242;
                auVar254._0_4_ = sqrtf(auVar86._0_4_);
                auVar254._4_60_ = extraout_var_00;
                auVar86 = auVar254._0_16_;
                fVar242 = (float)local_6c0._0_4_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                local_6a0._0_4_ = fVar241;
              }
              local_440._4_4_ = local_660._0_4_;
              local_440._0_4_ = local_440._4_4_;
              fStack_438 = (float)local_440._4_4_;
              fStack_434 = (float)local_440._4_4_;
              auVar3 = vfnmsub213ss_fma(local_8e0._0_16_,local_8e0._0_16_,
                                        ZEXT416((uint)(fVar242 * 4.0)));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * 4.0)),local_660._0_16_,
                                        local_660._0_16_);
              fVar241 = (float)local_440._4_4_ * -(float)local_440._4_4_ * 0.5;
              fVar242 = auVar3._0_4_ * 0.5;
              fVar243 = auVar87._0_4_ * 0.5;
              local_6a0._0_4_ = (float)local_6a0._0_4_ * 0.5;
              auVar210._0_4_ = (float)local_6a0._0_4_ * (float)local_5c0._0_4_;
              auVar210._4_4_ = (float)local_6a0._0_4_ * (float)local_5c0._4_4_;
              auVar210._8_4_ = (float)local_6a0._0_4_ * fStack_5b8;
              auVar210._12_4_ = (float)local_6a0._0_4_ * fStack_5b4;
              auVar173._4_4_ = fVar243;
              auVar173._0_4_ = fVar243;
              auVar173._8_4_ = fVar243;
              auVar173._12_4_ = fVar243;
              auVar87 = vfmadd132ps_fma(auVar173,auVar210,local_580._0_16_);
              auVar191._4_4_ = fVar242;
              auVar191._0_4_ = fVar242;
              auVar191._8_4_ = fVar242;
              auVar191._12_4_ = fVar242;
              auVar87 = vfmadd132ps_fma(auVar191,auVar87,local_5a0._0_16_);
              auVar253._4_4_ = fVar241;
              auVar253._0_4_ = fVar241;
              auVar253._8_4_ = fVar241;
              auVar253._12_4_ = fVar241;
              local_6a0._0_16_ = vfmadd132ps_fma(auVar253,auVar87,local_560._0_16_);
              local_460._0_16_ = vdpps_avx(local_6a0._0_16_,local_6a0._0_16_,0x7f);
              auVar69._12_4_ = 0;
              auVar69._0_12_ = ZEXT812(0);
              fVar241 = local_460._0_4_;
              _local_8b0 = vrsqrt14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar241));
              fVar242 = local_8b0._0_4_;
              local_4a0 = vrcp14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar241));
              auVar87 = vfnmadd213ss_fma(local_4a0,local_460._0_16_,ZEXT416(0x40000000));
              local_6c0._0_4_ = auVar86._0_4_;
              if (fVar241 < -fVar241) {
                local_8c0._0_4_ = fVar241 * -0.5;
                fVar243 = sqrtf(fVar241);
                auVar86 = ZEXT416((uint)local_6c0._0_4_);
                fVar241 = (float)local_8c0._0_4_;
                auVar3 = local_6a0._0_16_;
              }
              else {
                auVar3 = vsqrtss_avx(local_460._0_16_,local_460._0_16_);
                fVar243 = auVar3._0_4_;
                fVar241 = fVar241 * -0.5;
                auVar3 = local_6a0._0_16_;
              }
              fVar216 = local_8b0._0_4_;
              local_8b0._4_4_ = fVar242 * 1.5 + fVar241 * fVar216 * fVar216 * fVar216;
              local_8b0._0_4_ = local_8b0._4_4_;
              fStack_8a8 = (float)local_8b0._4_4_;
              fStack_8a4 = (float)local_8b0._4_4_;
              auVar255._0_4_ = auVar3._0_4_ * (float)local_8b0._4_4_;
              auVar255._4_4_ = auVar3._4_4_ * (float)local_8b0._4_4_;
              auVar255._8_4_ = auVar3._8_4_ * (float)local_8b0._4_4_;
              auVar255._12_4_ = auVar3._12_4_ * (float)local_8b0._4_4_;
              auVar91 = vdpps_avx(local_7a0._0_16_,auVar255,0x7f);
              fVar242 = auVar86._0_4_;
              auVar149._0_4_ = auVar91._0_4_ * auVar91._0_4_;
              auVar149._4_4_ = auVar91._4_4_ * auVar91._4_4_;
              auVar149._8_4_ = auVar91._8_4_ * auVar91._8_4_;
              auVar149._12_4_ = auVar91._12_4_ * auVar91._12_4_;
              auVar84 = vsubps_avx(local_600._0_16_,auVar149);
              fVar241 = auVar84._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar241;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar85 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
              auVar89 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              if (fVar241 < 0.0) {
                local_4d0 = auVar89._0_4_;
                local_8c0 = auVar91;
                local_4c0 = auVar255;
                local_4b0 = auVar88;
                fVar241 = sqrtf(fVar241);
                auVar89 = ZEXT416((uint)local_4d0);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar86 = ZEXT416((uint)local_6c0._0_4_);
                auVar88 = local_4b0;
                auVar3 = local_6a0._0_16_;
                auVar91 = local_8c0;
                auVar255 = local_4c0;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar241 = auVar84._0_4_;
              }
              auVar254 = ZEXT1664(auVar3);
              auVar251 = ZEXT1664(local_600._0_16_);
              auVar247 = ZEXT1664(local_7a0._0_16_);
              auVar264 = ZEXT3264(local_680);
              auVar262 = ZEXT3264(local_7c0);
              auVar256 = ZEXT3264(local_7e0);
              auVar257 = ZEXT3264(local_6e0);
              auVar258 = ZEXT3264(local_700);
              auVar259 = ZEXT3264(local_800);
              auVar260 = ZEXT3264(local_720);
              auVar261 = ZEXT3264(local_820);
              auVar263 = ZEXT3264(local_740);
              auVar265 = ZEXT3264(local_840);
              auVar266 = ZEXT3264(local_760);
              auVar267 = ZEXT3264(local_780);
              auVar269 = ZEXT3264(local_860);
              auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_660._0_16_,
                                       local_8e0._0_16_);
              auVar17 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_660._0_16_);
              auVar84 = vshufps_avx(_local_540,_local_540,0x55);
              auVar192._0_4_ = auVar84._0_4_ * (float)local_5c0._0_4_;
              auVar192._4_4_ = auVar84._4_4_ * (float)local_5c0._4_4_;
              auVar192._8_4_ = auVar84._8_4_ * fStack_5b8;
              auVar192._12_4_ = auVar84._12_4_ * fStack_5b4;
              auVar211._0_4_ = auVar17._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar84 = vfmadd132ps_fma(auVar211,auVar192,local_580._0_16_);
              auVar175._0_4_ = auVar4._0_4_;
              auVar175._4_4_ = auVar175._0_4_;
              auVar175._8_4_ = auVar175._0_4_;
              auVar175._12_4_ = auVar175._0_4_;
              auVar84 = vfmadd132ps_fma(auVar175,auVar84,local_5a0._0_16_);
              auVar84 = vfmadd132ps_fma(_local_440,auVar84,local_560._0_16_);
              auVar176._0_4_ = auVar84._0_4_ * (float)local_460._0_4_;
              auVar176._4_4_ = auVar84._4_4_ * (float)local_460._0_4_;
              auVar176._8_4_ = auVar84._8_4_ * (float)local_460._0_4_;
              auVar176._12_4_ = auVar84._12_4_ * (float)local_460._0_4_;
              auVar84 = vdpps_avx(auVar3,auVar84,0x7f);
              fVar216 = auVar84._0_4_;
              auVar193._0_4_ = auVar3._0_4_ * fVar216;
              auVar193._4_4_ = auVar3._4_4_ * fVar216;
              auVar193._8_4_ = auVar3._8_4_ * fVar216;
              auVar193._12_4_ = auVar3._12_4_ * fVar216;
              auVar84 = vsubps_avx(auVar176,auVar193);
              fVar216 = auVar87._0_4_ * (float)local_4a0._0_4_;
              auVar4 = vmaxss_avx(ZEXT416((uint)fVar203),
                                  ZEXT416((uint)(local_540._0_4_ * fVar140 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar3,auVar26);
              auVar194._0_4_ = auVar84._0_4_ * fVar216 * (float)local_8b0._0_4_;
              auVar194._4_4_ = auVar84._4_4_ * fVar216 * (float)local_8b0._4_4_;
              auVar194._8_4_ = auVar84._8_4_ * fVar216 * fStack_8a8;
              auVar194._12_4_ = auVar84._12_4_ * fVar216 * fStack_8a4;
              auVar87 = vdpps_avx(auVar90,auVar255,0x7f);
              auVar84 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar203),auVar4);
              auVar86 = vdpps_avx(local_7a0._0_16_,auVar194,0x7f);
              auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar242 + 1.0)),
                                        ZEXT416((uint)(fVar203 / fVar243)),auVar84);
              fVar242 = auVar87._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_520._0_16_,auVar255,0x7f);
              auVar87 = vdpps_avx(local_7a0._0_16_,auVar90,0x7f);
              auVar84 = vmulss_avx512f(auVar89,auVar88);
              auVar89 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar84._0_4_ *
                                                             auVar88._0_4_ * auVar88._0_4_)));
              auVar84 = vdpps_avx(local_7a0._0_16_,local_520._0_16_,0x7f);
              auVar85 = vfnmadd231ss_fma(auVar87,auVar91,ZEXT416((uint)fVar242));
              auVar84 = vfnmadd231ss_fma(auVar84,auVar91,auVar86);
              auVar87 = vpermilps_avx(local_420._0_16_,0xff);
              fVar241 = fVar241 - auVar87._0_4_;
              auVar88 = vshufps_avx(auVar3,auVar3,0xff);
              auVar87 = vfmsub213ss_fma(auVar85,auVar89,auVar88);
              auVar239._8_4_ = 0x80000000;
              auVar239._0_8_ = 0x8000000080000000;
              auVar239._12_4_ = 0x80000000;
              auVar240 = ZEXT1664(auVar239);
              auVar233._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar233);
              auVar84 = ZEXT416((uint)(auVar84._0_4_ * auVar89._0_4_));
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                        ZEXT416((uint)fVar242),auVar84);
              auVar87 = vinsertps_avx(auVar233,auVar84,0x1c);
              auVar228._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar228._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar228._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar84 = vinsertps_avx(ZEXT416((uint)fVar242),auVar228,0x10);
              auVar212._0_4_ = auVar85._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar86 = vdivps_avx(auVar87,auVar212);
              auVar87 = vdivps_avx(auVar84,auVar212);
              fVar242 = auVar91._0_4_;
              auVar229 = ZEXT1664(CONCAT412(fVar241,CONCAT48(fVar241,CONCAT44(fVar241,fVar241))));
              auVar213._0_4_ = fVar242 * auVar86._0_4_ + fVar241 * auVar87._0_4_;
              auVar213._4_4_ = fVar242 * auVar86._4_4_ + fVar241 * auVar87._4_4_;
              auVar213._8_4_ = fVar242 * auVar86._8_4_ + fVar241 * auVar87._8_4_;
              auVar213._12_4_ = fVar242 * auVar86._12_4_ + fVar241 * auVar87._12_4_;
              auVar86 = vsubps_avx(_local_540,auVar213);
              auVar244 = ZEXT1664(auVar86);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx512vl(auVar91,auVar27);
              if (auVar87._0_4_ < auVar17._0_4_) {
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ + auVar4._0_4_)),local_4e0,
                                          ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar91 = vandps_avx512vl(ZEXT416((uint)fVar241),auVar28);
                if (auVar91._0_4_ < auVar87._0_4_) {
                  fVar140 = auVar86._0_4_ + (float)local_4f0._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar140) &&
                     (fVar241 = (ray->super_RayK<1>).tfar, fVar140 <= fVar241)) {
                    auVar87 = vmovshdup_avx(auVar86);
                    fVar242 = auVar87._0_4_;
                    if ((0.0 <= fVar242) && (fVar242 <= 1.0)) {
                      auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_600._0_4_)
                                                  );
                      fVar216 = auVar87._0_4_;
                      fVar243 = local_600._0_4_ * -0.5;
                      auVar229 = ZEXT464((uint)fVar243);
                      pGVar6 = (context->scene->geometries).items[local_8f0].ptr;
                      if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar243 = fVar216 * 1.5 + fVar243 * fVar216 * fVar216 * fVar216;
                        auVar214._0_4_ = local_7a0._0_4_ * fVar243;
                        auVar214._4_4_ = local_7a0._4_4_ * fVar243;
                        auVar214._8_4_ = local_7a0._8_4_ * fVar243;
                        auVar214._12_4_ = local_7a0._12_4_ * fVar243;
                        auVar88 = vfmadd213ps_fma(auVar88,auVar214,auVar3);
                        auVar87 = vshufps_avx(auVar214,auVar214,0xc9);
                        auVar91 = vshufps_avx(auVar3,auVar3,0xc9);
                        auVar215._0_4_ = auVar214._0_4_ * auVar91._0_4_;
                        auVar215._4_4_ = auVar214._4_4_ * auVar91._4_4_;
                        auVar215._8_4_ = auVar214._8_4_ * auVar91._8_4_;
                        auVar215._12_4_ = auVar214._12_4_ * auVar91._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar215,auVar3,auVar87);
                        auVar87 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar91 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar229 = ZEXT1664(auVar91);
                        auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                        auVar150._0_4_ = auVar88._0_4_ * auVar84._0_4_;
                        auVar150._4_4_ = auVar88._4_4_ * auVar84._4_4_;
                        auVar150._8_4_ = auVar88._8_4_ * auVar84._8_4_;
                        auVar150._12_4_ = auVar88._12_4_ * auVar84._12_4_;
                        auVar87 = vfmsub231ps_fma(auVar150,auVar87,auVar91);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar140;
                          auVar86 = vshufps_avx(auVar87,auVar87,0xe9);
                          uVar18 = vmovlps_avx(auVar86);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar18;
                          (ray->Ng).field_0.field_0.z = auVar87._0_4_;
                          ray->u = fVar242;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8e8;
                          ray->geomID = (uint)local_8f0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8e0._0_4_ = fVar241;
                          auVar84 = vshufps_avx(auVar87,auVar87,0xe9);
                          local_630 = vmovlps_avx(auVar84);
                          local_628 = auVar87._0_4_;
                          local_624 = fVar242;
                          local_620 = 0;
                          local_61c = (uint)local_8e8;
                          local_618 = (uint)local_8f0;
                          local_614 = context->user->instID[0];
                          local_610 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar140;
                          local_8f8 = -1;
                          local_8a0.valid = &local_8f8;
                          local_8a0.geometryUserPtr = pGVar6->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_630;
                          local_8a0.N = 1;
                          if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d67a21:
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar229 = ZEXT1664(auVar229._0_16_);
                              auVar236 = ZEXT1664(auVar236._0_16_);
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar244 = ZEXT1664(auVar244._0_16_);
                              auVar247 = ZEXT1664(auVar247._0_16_);
                              auVar251 = ZEXT1664(auVar251._0_16_);
                              auVar254 = ZEXT1664(auVar254._0_16_);
                              (*p_Var7)(&local_8a0);
                              auVar269 = ZEXT3264(local_860);
                              auVar267 = ZEXT3264(local_780);
                              auVar266 = ZEXT3264(local_760);
                              auVar265 = ZEXT3264(local_840);
                              auVar263 = ZEXT3264(local_740);
                              auVar261 = ZEXT3264(local_820);
                              auVar260 = ZEXT3264(local_720);
                              auVar259 = ZEXT3264(local_800);
                              auVar258 = ZEXT3264(local_700);
                              auVar257 = ZEXT3264(local_6e0);
                              auVar256 = ZEXT3264(local_7e0);
                              auVar262 = ZEXT3264(local_7c0);
                              auVar264 = ZEXT3264(local_680);
                              if (*local_8a0.valid == 0) goto LAB_01d67b28;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            auVar229 = ZEXT1664(auVar91);
                            auVar236 = ZEXT1664(auVar233);
                            auVar240 = ZEXT1664(auVar239);
                            auVar244 = ZEXT1664(auVar86);
                            auVar247 = ZEXT1664(local_7a0._0_16_);
                            auVar251 = ZEXT1664(local_600._0_16_);
                            auVar254 = ZEXT1664(auVar3);
                            (*pGVar6->intersectionFilterN)(&local_8a0);
                            auVar269 = ZEXT3264(local_860);
                            auVar267 = ZEXT3264(local_780);
                            auVar266 = ZEXT3264(local_760);
                            auVar265 = ZEXT3264(local_840);
                            auVar263 = ZEXT3264(local_740);
                            auVar261 = ZEXT3264(local_820);
                            auVar260 = ZEXT3264(local_720);
                            auVar259 = ZEXT3264(local_800);
                            auVar258 = ZEXT3264(local_700);
                            auVar257 = ZEXT3264(local_6e0);
                            auVar256 = ZEXT3264(local_7e0);
                            auVar262 = ZEXT3264(local_7c0);
                            auVar264 = ZEXT3264(local_680);
                            if (*local_8a0.valid != 0) goto LAB_01d67a21;
LAB_01d67b28:
                            (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar80 = lVar80 + -1;
            } while (lVar80 != 0);
            fVar140 = (ray->super_RayK<1>).tfar;
            auVar158._4_4_ = fVar140;
            auVar158._0_4_ = fVar140;
            auVar158._8_4_ = fVar140;
            auVar158._12_4_ = fVar140;
            auVar158._16_4_ = fVar140;
            auVar158._20_4_ = fVar140;
            auVar158._24_4_ = fVar140;
            auVar158._28_4_ = fVar140;
            auVar74._4_4_ = fStack_3bc;
            auVar74._0_4_ = local_3c0;
            auVar74._8_4_ = fStack_3b8;
            auVar74._12_4_ = fStack_3b4;
            auVar74._16_4_ = fStack_3b0;
            auVar74._20_4_ = fStack_3ac;
            auVar74._24_4_ = fStack_3a8;
            auVar74._28_4_ = fStack_3a4;
            uVar18 = vcmpps_avx512vl(auVar158,auVar74,0xd);
            bVar78 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar78 & (byte)uVar18;
          } while (bVar78 != 0);
          fVar203 = (float)local_5e0._0_4_;
          fVar140 = (float)local_5e0._4_4_;
          fVar241 = fStack_5d8;
          fVar242 = fStack_5d4;
          fVar243 = fStack_5d0;
          fVar216 = fStack_5cc;
          fVar217 = fStack_5c8;
          fVar165 = fStack_5c4;
        }
        uVar20 = vpcmpgtd_avx512vl(local_400,local_380);
        uVar21 = vpcmpd_avx512vl(local_380,local_2c0,1);
        auVar197._0_4_ = fVar203 + (float)local_340._0_4_;
        auVar197._4_4_ = fVar140 + (float)local_340._4_4_;
        auVar197._8_4_ = fVar241 + fStack_338;
        auVar197._12_4_ = fVar242 + fStack_334;
        auVar197._16_4_ = fVar243 + fStack_330;
        auVar197._20_4_ = fVar216 + fStack_32c;
        auVar197._24_4_ = fVar217 + fStack_328;
        auVar197._28_4_ = fVar165 + fStack_324;
        uVar18 = vcmpps_avx512vl(auVar197,auVar158,2);
        bVar78 = (byte)local_868 & (byte)uVar21 & (byte)uVar18;
        auVar198._0_4_ = fVar203 + local_300._0_4_;
        auVar198._4_4_ = fVar140 + local_300._4_4_;
        auVar198._8_4_ = fVar241 + local_300._8_4_;
        auVar198._12_4_ = fVar242 + local_300._12_4_;
        auVar198._16_4_ = fVar243 + local_300._16_4_;
        auVar198._20_4_ = fVar216 + local_300._20_4_;
        auVar198._24_4_ = fVar217 + local_300._24_4_;
        auVar198._28_4_ = fVar165 + local_300._28_4_;
        uVar18 = vcmpps_avx512vl(auVar198,auVar158,2);
        bVar75 = bVar75 & (byte)uVar20 & (byte)uVar18 | bVar78;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar268 = ZEXT3264(auVar97);
        prim = local_488;
        if (bVar75 != 0) {
          abStack_180[uVar77 * 0x60] = bVar75;
          bVar9 = (bool)(bVar78 >> 1 & 1);
          bVar10 = (bool)(bVar78 >> 2 & 1);
          bVar11 = (bool)(bVar78 >> 3 & 1);
          bVar12 = (bool)(bVar78 >> 4 & 1);
          bVar13 = (bool)(bVar78 >> 5 & 1);
          bVar14 = (bool)(bVar78 >> 6 & 1);
          auStack_160[uVar77 * 0x18] =
               (uint)(bVar78 & 1) * local_340._0_4_ |
               (uint)!(bool)(bVar78 & 1) * (int)local_300._0_4_;
          auStack_160[uVar77 * 0x18 + 1] =
               (uint)bVar9 * local_340._4_4_ | (uint)!bVar9 * (int)local_300._4_4_;
          auStack_160[uVar77 * 0x18 + 2] =
               (uint)bVar10 * (int)fStack_338 | (uint)!bVar10 * (int)local_300._8_4_;
          auStack_160[uVar77 * 0x18 + 3] =
               (uint)bVar11 * (int)fStack_334 | (uint)!bVar11 * (int)local_300._12_4_;
          auStack_160[uVar77 * 0x18 + 4] =
               (uint)bVar12 * (int)fStack_330 | (uint)!bVar12 * (int)local_300._16_4_;
          auStack_160[uVar77 * 0x18 + 5] =
               (uint)bVar13 * (int)fStack_32c | (uint)!bVar13 * (int)local_300._20_4_;
          auStack_160[uVar77 * 0x18 + 6] =
               (uint)bVar14 * (int)fStack_328 | (uint)!bVar14 * (int)local_300._24_4_;
          auStack_160[uVar77 * 0x18 + 7] =
               (uint)(bVar78 >> 7) * (int)fStack_324 |
               (uint)!(bool)(bVar78 >> 7) * (int)local_300._28_4_;
          uVar79 = vmovlps_avx(local_390);
          (&uStack_140)[uVar77 * 0xc] = uVar79;
          aiStack_138[uVar77 * 0x18] = local_864 + 1;
          uVar77 = (ulong)((int)uVar77 + 1);
        }
      }
    }
    fVar202 = (ray->super_RayK<1>).tfar;
    auVar153._4_4_ = fVar202;
    auVar153._0_4_ = fVar202;
    auVar153._8_4_ = fVar202;
    auVar153._12_4_ = fVar202;
    auVar153._16_4_ = fVar202;
    auVar153._20_4_ = fVar202;
    auVar153._24_4_ = fVar202;
    auVar153._28_4_ = fVar202;
    do {
      uVar83 = (uint)uVar77;
      uVar77 = (ulong)(uVar83 - 1);
      if (uVar83 == 0) {
        uVar18 = vcmpps_avx512vl(auVar153,local_2a0,0xd);
        uVar83 = (uint)uVar81 & (uint)uVar18;
        uVar81 = (ulong)uVar83;
        if (uVar83 == 0) {
          return;
        }
        goto LAB_01d6546e;
      }
      auVar97 = *(undefined1 (*) [32])(auStack_160 + uVar77 * 0x18);
      auVar195._0_4_ = fVar203 + auVar97._0_4_;
      auVar195._4_4_ = fVar140 + auVar97._4_4_;
      auVar195._8_4_ = fVar241 + auVar97._8_4_;
      auVar195._12_4_ = fVar242 + auVar97._12_4_;
      auVar195._16_4_ = fVar243 + auVar97._16_4_;
      auVar195._20_4_ = fVar216 + auVar97._20_4_;
      auVar195._24_4_ = fVar217 + auVar97._24_4_;
      auVar195._28_4_ = fVar165 + auVar97._28_4_;
      uVar18 = vcmpps_avx512vl(auVar195,auVar153,2);
      uVar133 = (uint)uVar18 & (uint)abStack_180[uVar77 * 0x60];
    } while (uVar133 == 0);
    uVar79 = (&uStack_140)[uVar77 * 0xc];
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar79;
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar95 = vblendmps_avx512vl(auVar196,auVar97);
    bVar75 = (byte)uVar133;
    auVar130._0_4_ =
         (uint)(bVar75 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)auVar97._0_4_;
    bVar9 = (bool)((byte)(uVar133 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar9 * auVar95._4_4_ | (uint)!bVar9 * (int)auVar97._4_4_;
    bVar9 = (bool)((byte)(uVar133 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar9 * auVar95._8_4_ | (uint)!bVar9 * (int)auVar97._8_4_;
    bVar9 = (bool)((byte)(uVar133 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar9 * auVar95._12_4_ | (uint)!bVar9 * (int)auVar97._12_4_;
    bVar9 = (bool)((byte)(uVar133 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar9 * auVar95._16_4_ | (uint)!bVar9 * (int)auVar97._16_4_;
    bVar9 = (bool)((byte)(uVar133 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar9 * auVar95._20_4_ | (uint)!bVar9 * (int)auVar97._20_4_;
    bVar9 = (bool)((byte)(uVar133 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar9 * auVar95._24_4_ | (uint)!bVar9 * (int)auVar97._24_4_;
    auVar130._28_4_ =
         (uVar133 >> 7) * auVar95._28_4_ | (uint)!SUB41(uVar133 >> 7,0) * (int)auVar97._28_4_;
    auVar97 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar97 = vminps_avx(auVar130,auVar97);
    auVar95 = vshufpd_avx(auVar97,auVar97,5);
    auVar97 = vminps_avx(auVar97,auVar95);
    auVar95 = vpermpd_avx2(auVar97,0x4e);
    auVar97 = vminps_avx(auVar97,auVar95);
    uVar18 = vcmpps_avx512vl(auVar130,auVar97,0);
    bVar78 = (byte)uVar18 & bVar75;
    if (bVar78 != 0) {
      uVar133 = (uint)bVar78;
    }
    uVar134 = 0;
    for (; (uVar133 & 1) == 0; uVar133 = uVar133 >> 1 | 0x80000000) {
      uVar134 = uVar134 + 1;
    }
    local_864 = aiStack_138[uVar77 * 0x18];
    bVar75 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar75;
    abStack_180[uVar77 * 0x60] = bVar75;
    if (bVar75 == 0) {
      uVar83 = uVar83 - 1;
    }
    uVar142 = (undefined4)uVar79;
    auVar177._4_4_ = uVar142;
    auVar177._0_4_ = uVar142;
    auVar177._8_4_ = uVar142;
    auVar177._12_4_ = uVar142;
    auVar177._16_4_ = uVar142;
    auVar177._20_4_ = uVar142;
    auVar177._24_4_ = uVar142;
    auVar177._28_4_ = uVar142;
    auVar86 = vmovshdup_avx(auVar144);
    auVar86 = vsubps_avx(auVar86,auVar144);
    auVar154._0_4_ = auVar86._0_4_;
    auVar154._4_4_ = auVar154._0_4_;
    auVar154._8_4_ = auVar154._0_4_;
    auVar154._12_4_ = auVar154._0_4_;
    auVar154._16_4_ = auVar154._0_4_;
    auVar154._20_4_ = auVar154._0_4_;
    auVar154._24_4_ = auVar154._0_4_;
    auVar154._28_4_ = auVar154._0_4_;
    auVar86 = vfmadd132ps_fma(auVar154,auVar177,_DAT_01faff20);
    _local_340 = ZEXT1632(auVar86);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_340 + (ulong)uVar134 * 4);
    uVar77 = (ulong)uVar83;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }